

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O1

size_t ZSTD_compressBlock_lazy_extDict_row
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong *puVar4;
  ulong *iEnd;
  BYTE *iStart;
  undefined8 *puVar5;
  ulong *iLimit;
  char *pcVar6;
  char *pcVar7;
  byte bVar8;
  uint uVar9;
  uint uVar10;
  BYTE *base_00;
  BYTE *pBVar11;
  U32 *pUVar12;
  U16 *pUVar13;
  seqDef *psVar14;
  int iVar15;
  ushort uVar16;
  undefined8 uVar17;
  U32 target;
  uint uVar18;
  int iVar19;
  ulong *puVar20;
  BYTE *pBVar21;
  size_t sVar22;
  ulong uVar23;
  BYTE *pBVar24;
  ulong uVar25;
  BYTE *pBVar26;
  ulong uVar27;
  U32 UVar28;
  uint uVar29;
  ulong *puVar30;
  BYTE *pBVar31;
  uint uVar32;
  ulong *puVar33;
  BYTE *pBVar34;
  int iVar35;
  ulong *puVar36;
  ulong uVar37;
  BYTE *base;
  long lVar38;
  uint uVar39;
  ulong *puVar40;
  ulong uVar41;
  uint uVar42;
  int iVar43;
  uint uVar44;
  uint uVar45;
  U32 *hashTable_3;
  ulong uVar46;
  uint uVar47;
  U32 UVar48;
  BYTE *base_6;
  BYTE *pBVar49;
  ulong uVar50;
  bool bVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  U32 hashLog_3;
  U32 maxDistance;
  BYTE *litLimit_w;
  char local_180;
  BYTE *local_160;
  uint local_134;
  ulong *local_130;
  ulong *local_128;
  uint auStack_b8 [34];
  char cVar58;
  undefined1 uVar76;
  char cVar77;
  undefined1 uVar78;
  char cVar79;
  undefined1 uVar80;
  char cVar81;
  
  iEnd = (ulong *)((long)src + srcSize);
  iLimit = (ulong *)((long)src + (srcSize - 0x10));
  base_00 = (ms->window).base;
  pBVar11 = (ms->window).dictBase;
  uVar9 = (ms->window).dictLimit;
  iStart = base_00 + uVar9;
  uVar10 = (ms->window).lowLimit;
  puVar36 = (ulong *)((ulong)(iStart == (BYTE *)src) + (long)src);
  uVar18 = (ms->cParams).minMatch;
  UVar48 = 6;
  if (uVar18 < 6) {
    UVar48 = uVar18;
  }
  uVar18 = (ms->cParams).windowLog;
  local_134 = *rep;
  uVar42 = rep[1];
  ZSTD_row_fillHashCache
            (ms,base_00,5 - ((ms->cParams).searchLog < 5),UVar48,ms->nextToUpdate,(BYTE *)iLimit);
  local_130 = (ulong *)src;
  if (puVar36 < iLimit) {
    puVar20 = (ulong *)(pBVar11 + uVar9);
    uVar18 = 1 << ((byte)uVar18 & 0x1f);
    iVar19 = uVar9 - 1;
    puVar1 = (ulong *)((long)iEnd - 7);
    puVar2 = (ulong *)((long)iEnd - 3);
    puVar3 = (ulong *)((long)iEnd - 1);
    puVar4 = iEnd + -4;
    do {
      iVar35 = (int)puVar36 - (int)base_00;
      iVar43 = iVar35 + 1;
      uVar47 = (ms->window).lowLimit;
      UVar48 = ms->loadedDictEnd;
      uVar29 = iVar43 - uVar18;
      if (iVar43 - uVar47 <= uVar18) {
        uVar29 = uVar47;
      }
      if (UVar48 != 0) {
        uVar29 = uVar47;
      }
      uVar44 = iVar43 - local_134;
      pBVar31 = base_00;
      if (uVar44 < uVar9) {
        pBVar31 = pBVar11;
      }
      if (iVar19 - uVar44 < 3) {
        pBVar21 = (BYTE *)0x0;
      }
      else {
        pBVar21 = (BYTE *)0x0;
        if (local_134 < (iVar35 - uVar29) + 1) {
          if (*(int *)((long)puVar36 + 1) == *(int *)(pBVar31 + uVar44)) {
            puVar40 = iEnd;
            if (uVar44 < uVar9) {
              puVar40 = puVar20;
            }
            sVar22 = ZSTD_count_2segments
                               ((BYTE *)((long)puVar36 + 5),(BYTE *)((long)(pBVar31 + uVar44) + 4),
                                (BYTE *)iEnd,(BYTE *)puVar40,iStart);
            pBVar21 = (BYTE *)(sVar22 + 4);
          }
          else {
            pBVar21 = (BYTE *)0x0;
          }
        }
      }
      uVar29 = (ms->cParams).searchLog;
      uVar44 = (ms->cParams).minMatch;
      if (uVar29 < 5) {
        if (uVar44 - 6 < 2) {
          pBVar31 = (ms->window).base;
          pBVar34 = (ms->window).dictBase;
          uVar44 = (ms->window).dictLimit;
          uVar23 = (long)puVar36 - (long)pBVar31;
          uVar39 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
          uVar32 = (uint)uVar23;
          uVar45 = uVar32 - uVar39;
          if (uVar32 - uVar47 <= uVar39) {
            uVar45 = uVar47;
          }
          pUVar12 = ms->hashTable;
          if (UVar48 != 0) {
            uVar45 = uVar47;
          }
          if (3 < uVar29) {
            uVar29 = 4;
          }
          iVar43 = 1 << ((byte)uVar29 & 0x1f);
          pUVar13 = ms->tagTable;
          uVar46 = (ulong)ms->nextToUpdate;
          cVar58 = (char)ms->rowHashLog;
          if (ms->nextToUpdate < uVar32) {
            do {
              uVar29 = (uint)uVar46 & 7;
              uVar47 = ms->hashCache[uVar29];
              ms->hashCache[uVar29] =
                   (U32)((ulong)(*(long *)(pBVar31 + uVar46 + 8) * -0x30e4432340650000) >>
                        (0x38U - cVar58 & 0x3f));
              uVar50 = (ulong)(uVar47 >> 4 & 0xfffffff0);
              uVar29 = (byte)((char)pUVar13[uVar50] - 1) & 0xf;
              *(char *)(pUVar13 + uVar50) = (char)uVar29;
              *(char *)((long)pUVar13 + (ulong)uVar29 + 1 + uVar50 * 2) = (char)uVar47;
              pUVar12[uVar50 + uVar29] = (uint)uVar46;
              uVar46 = uVar46 + 1;
            } while (uVar46 < (uVar23 & 0xffffffff));
          }
          ms->nextToUpdate = uVar32;
          uVar47 = ms->hashCache[uVar32 & 7];
          ms->hashCache[uVar32 & 7] =
               (U32)((ulong)(*(long *)(pBVar31 + (uVar23 & 0xffffffff) + 8) * -0x30e4432340650000)
                    >> (0x38U - cVar58 & 0x3f));
          uVar23 = (ulong)(uVar47 >> 4 & 0xfffffff0);
          bVar8 = (byte)pUVar13[uVar23];
          pcVar6 = (char *)((long)pUVar13 + uVar23 * 2 + 1);
          uVar80 = (undefined1)(uVar47 >> 0x18);
          uVar78 = (undefined1)(uVar47 >> 0x10);
          uVar76 = (undefined1)(uVar47 >> 8);
          auVar60._4_4_ =
               (int)(CONCAT35(CONCAT21(CONCAT11(uVar80,uVar80),uVar78),CONCAT14(uVar78,uVar47)) >>
                    0x20);
          auVar60[3] = uVar76;
          auVar60[2] = uVar76;
          auVar60[0] = (undefined1)uVar47;
          auVar60[1] = auVar60[0];
          auVar60._8_8_ = 0;
          auVar83 = pshuflw(auVar60,auVar60,0);
          cVar58 = auVar83[0];
          auVar61[0] = -(cVar58 == *pcVar6);
          cVar77 = auVar83[1];
          auVar61[1] = -(cVar77 == pcVar6[1]);
          cVar79 = auVar83[2];
          auVar61[2] = -(cVar79 == pcVar6[2]);
          cVar81 = auVar83[3];
          auVar61[3] = -(cVar81 == pcVar6[3]);
          auVar61[4] = -(cVar58 == pcVar6[4]);
          auVar61[5] = -(cVar77 == pcVar6[5]);
          auVar61[6] = -(cVar79 == pcVar6[6]);
          auVar61[7] = -(cVar81 == pcVar6[7]);
          auVar61[8] = -(cVar58 == pcVar6[8]);
          auVar61[9] = -(cVar77 == pcVar6[9]);
          auVar61[10] = -(cVar79 == pcVar6[10]);
          auVar61[0xb] = -(cVar81 == pcVar6[0xb]);
          auVar61[0xc] = -(cVar58 == pcVar6[0xc]);
          auVar61[0xd] = -(cVar77 == pcVar6[0xd]);
          auVar61[0xe] = -(cVar79 == pcVar6[0xe]);
          auVar61[0xf] = -(cVar81 == pcVar6[0xf]);
          uVar16 = (ushort)(SUB161(auVar61 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar61 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar61 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar61 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar61 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar61 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar61 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar61 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar61 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar61 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar61 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar61 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar61 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar61 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar61 >> 0x77,0) & 1) << 0xe |
                   (ushort)(auVar61[0xf] >> 7) << 0xf;
          uVar47 = (uint)uVar16;
          if ((bVar8 & 0xf) != 0) {
            uVar47 = (uint)uVar16 << (0x10 - (bVar8 & 0xf) & 0x1f) & 0xfffe |
                     (uint)(uVar16 >> (bVar8 & 0xf));
          }
          if (uVar47 == 0) {
            uVar46 = 0;
          }
          else {
            uVar46 = 0;
            while( true ) {
              iVar43 = iVar43 + -1;
              iVar15 = 0;
              if (uVar47 != 0) {
                for (; (uVar47 >> iVar15 & 1) == 0; iVar15 = iVar15 + 1) {
                }
              }
              if (pUVar12[uVar23 + (iVar15 + (uint)bVar8 & 0xf)] < uVar45) break;
              auStack_b8[uVar46] = pUVar12[uVar23 + (iVar15 + (uint)bVar8 & 0xf)];
              uVar46 = uVar46 + 1;
              uVar47 = uVar47 & uVar47 - 1;
              if ((uVar47 == 0) || (iVar43 == 0)) break;
            }
          }
          uVar47 = bVar8 - 1 & 0xf;
          *(char *)(pUVar13 + uVar23) = (char)uVar47;
          *(undefined1 *)((long)(pUVar13 + uVar23) + (ulong)uVar47 + 1) = auVar60[0];
          UVar48 = ms->nextToUpdate;
          ms->nextToUpdate = UVar48 + 1;
          pUVar12[uVar23 + uVar47] = UVar48;
          if (uVar46 == 0) goto LAB_0020342a;
          uVar23 = 999999999;
          uVar50 = 0;
          pBVar26 = (BYTE *)0x3;
          do {
            uVar47 = auStack_b8[uVar50];
            if (uVar47 < uVar44) {
              if (*(int *)(pBVar34 + uVar47) == (int)*puVar36) {
                sVar22 = ZSTD_count_2segments
                                   ((BYTE *)((long)puVar36 + 4),pBVar34 + (ulong)uVar47 + 4,
                                    (BYTE *)iEnd,pBVar34 + uVar44,pBVar31 + uVar44);
                pBVar24 = (BYTE *)(sVar22 + 4);
              }
              else {
LAB_00202c65:
                pBVar24 = (BYTE *)0x0;
              }
            }
            else {
              puVar40 = (ulong *)(pBVar31 + uVar47);
              if (pBVar26[(long)puVar40] != *(BYTE *)((long)puVar36 + (long)pBVar26))
              goto LAB_00202c65;
              puVar30 = puVar36;
              if (puVar36 < puVar1) {
                uVar25 = *puVar36 ^ *puVar40;
                uVar37 = 0;
                if (uVar25 != 0) {
                  for (; (uVar25 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
                  }
                }
                pBVar24 = (BYTE *)(uVar37 >> 3 & 0x1fffffff);
                if (*puVar40 == *puVar36) {
                  do {
                    puVar30 = puVar30 + 1;
                    puVar40 = puVar40 + 1;
                    if (puVar1 <= puVar30) goto LAB_00202c72;
                    uVar25 = *puVar30 ^ *puVar40;
                    uVar37 = 0;
                    if (uVar25 != 0) {
                      for (; (uVar25 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
                      }
                    }
                    pBVar24 = (BYTE *)((long)puVar30 + ((uVar37 >> 3 & 0x1fffffff) - (long)puVar36))
                    ;
                  } while (*puVar40 == *puVar30);
                }
              }
              else {
LAB_00202c72:
                if ((puVar30 < puVar2) && ((int)*puVar40 == (int)*puVar30)) {
                  puVar30 = (ulong *)((long)puVar30 + 4);
                  puVar40 = (ulong *)((long)puVar40 + 4);
                }
                if ((puVar30 < puVar3) && ((short)*puVar40 == (short)*puVar30)) {
                  puVar30 = (ulong *)((long)puVar30 + 2);
                  puVar40 = (ulong *)((long)puVar40 + 2);
                }
                if (puVar30 < iEnd) {
                  puVar30 = (ulong *)((long)puVar30 + (ulong)((BYTE)*puVar40 == (BYTE)*puVar30));
                }
                pBVar24 = (BYTE *)((long)puVar30 - (long)puVar36);
              }
            }
            pBVar49 = pBVar26;
            if (pBVar26 < pBVar24) {
              pBVar49 = pBVar24;
              uVar23 = (ulong)((uVar32 + 2) - uVar47);
            }
          } while ((pBVar24 <= pBVar26 || (ulong *)((long)puVar36 + (long)pBVar24) != iEnd) &&
                  (uVar50 = uVar50 + 1, pBVar26 = pBVar49, uVar50 < uVar46));
        }
        else if (uVar44 == 5) {
          pBVar31 = (ms->window).base;
          pBVar34 = (ms->window).dictBase;
          uVar44 = (ms->window).dictLimit;
          uVar23 = (long)puVar36 - (long)pBVar31;
          uVar39 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
          uVar32 = (uint)uVar23;
          uVar45 = uVar32 - uVar39;
          if (uVar32 - uVar47 <= uVar39) {
            uVar45 = uVar47;
          }
          pUVar12 = ms->hashTable;
          if (UVar48 != 0) {
            uVar45 = uVar47;
          }
          if (3 < uVar29) {
            uVar29 = 4;
          }
          iVar43 = 1 << ((byte)uVar29 & 0x1f);
          pUVar13 = ms->tagTable;
          uVar46 = (ulong)ms->nextToUpdate;
          cVar58 = (char)ms->rowHashLog;
          if (ms->nextToUpdate < uVar32) {
            do {
              uVar29 = (uint)uVar46 & 7;
              uVar47 = ms->hashCache[uVar29];
              ms->hashCache[uVar29] =
                   (U32)((ulong)(*(long *)(pBVar31 + uVar46 + 8) * -0x30e4432345000000) >>
                        (0x38U - cVar58 & 0x3f));
              uVar50 = (ulong)(uVar47 >> 4 & 0xfffffff0);
              uVar29 = (byte)((char)pUVar13[uVar50] - 1) & 0xf;
              *(char *)(pUVar13 + uVar50) = (char)uVar29;
              *(char *)((long)pUVar13 + (ulong)uVar29 + 1 + uVar50 * 2) = (char)uVar47;
              pUVar12[uVar50 + uVar29] = (uint)uVar46;
              uVar46 = uVar46 + 1;
            } while (uVar46 < (uVar23 & 0xffffffff));
          }
          ms->nextToUpdate = uVar32;
          uVar47 = ms->hashCache[uVar32 & 7];
          ms->hashCache[uVar32 & 7] =
               (U32)((ulong)(*(long *)(pBVar31 + (uVar23 & 0xffffffff) + 8) * -0x30e4432345000000)
                    >> (0x38U - cVar58 & 0x3f));
          uVar23 = (ulong)(uVar47 >> 4 & 0xfffffff0);
          bVar8 = (byte)pUVar13[uVar23];
          pcVar6 = (char *)((long)pUVar13 + uVar23 * 2 + 1);
          uVar80 = (undefined1)(uVar47 >> 0x18);
          uVar78 = (undefined1)(uVar47 >> 0x10);
          uVar76 = (undefined1)(uVar47 >> 8);
          auVar65._4_4_ =
               (int)(CONCAT35(CONCAT21(CONCAT11(uVar80,uVar80),uVar78),CONCAT14(uVar78,uVar47)) >>
                    0x20);
          auVar65[3] = uVar76;
          auVar65[2] = uVar76;
          auVar65[0] = (undefined1)uVar47;
          auVar65[1] = auVar65[0];
          auVar65._8_8_ = 0;
          auVar83 = pshuflw(auVar65,auVar65,0);
          cVar58 = auVar83[0];
          auVar63[0] = -(cVar58 == *pcVar6);
          cVar77 = auVar83[1];
          auVar63[1] = -(cVar77 == pcVar6[1]);
          cVar79 = auVar83[2];
          auVar63[2] = -(cVar79 == pcVar6[2]);
          cVar81 = auVar83[3];
          auVar63[3] = -(cVar81 == pcVar6[3]);
          auVar63[4] = -(cVar58 == pcVar6[4]);
          auVar63[5] = -(cVar77 == pcVar6[5]);
          auVar63[6] = -(cVar79 == pcVar6[6]);
          auVar63[7] = -(cVar81 == pcVar6[7]);
          auVar63[8] = -(cVar58 == pcVar6[8]);
          auVar63[9] = -(cVar77 == pcVar6[9]);
          auVar63[10] = -(cVar79 == pcVar6[10]);
          auVar63[0xb] = -(cVar81 == pcVar6[0xb]);
          auVar63[0xc] = -(cVar58 == pcVar6[0xc]);
          auVar63[0xd] = -(cVar77 == pcVar6[0xd]);
          auVar63[0xe] = -(cVar79 == pcVar6[0xe]);
          auVar63[0xf] = -(cVar81 == pcVar6[0xf]);
          uVar16 = (ushort)(SUB161(auVar63 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar63 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar63 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar63 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar63 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar63 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar63 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar63 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar63 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar63 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar63 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar63 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar63 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar63 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar63 >> 0x77,0) & 1) << 0xe |
                   (ushort)(auVar63[0xf] >> 7) << 0xf;
          uVar47 = (uint)uVar16;
          if ((bVar8 & 0xf) != 0) {
            uVar47 = (uint)uVar16 << (0x10 - (bVar8 & 0xf) & 0x1f) & 0xfffe |
                     (uint)(uVar16 >> (bVar8 & 0xf));
          }
          if (uVar47 == 0) {
            uVar46 = 0;
          }
          else {
            uVar46 = 0;
            while( true ) {
              iVar43 = iVar43 + -1;
              iVar15 = 0;
              if (uVar47 != 0) {
                for (; (uVar47 >> iVar15 & 1) == 0; iVar15 = iVar15 + 1) {
                }
              }
              if (pUVar12[uVar23 + (iVar15 + (uint)bVar8 & 0xf)] < uVar45) break;
              auStack_b8[uVar46] = pUVar12[uVar23 + (iVar15 + (uint)bVar8 & 0xf)];
              uVar46 = uVar46 + 1;
              uVar47 = uVar47 & uVar47 - 1;
              if ((uVar47 == 0) || (iVar43 == 0)) break;
            }
          }
          uVar47 = bVar8 - 1 & 0xf;
          *(char *)(pUVar13 + uVar23) = (char)uVar47;
          *(undefined1 *)((long)(pUVar13 + uVar23) + (ulong)uVar47 + 1) = auVar65[0];
          UVar48 = ms->nextToUpdate;
          ms->nextToUpdate = UVar48 + 1;
          pUVar12[uVar23 + uVar47] = UVar48;
          if (uVar46 == 0) goto LAB_0020342a;
          uVar23 = 999999999;
          uVar50 = 0;
          pBVar26 = (BYTE *)0x3;
          do {
            uVar47 = auStack_b8[uVar50];
            if (uVar47 < uVar44) {
              if (*(int *)(pBVar34 + uVar47) == (int)*puVar36) {
                sVar22 = ZSTD_count_2segments
                                   ((BYTE *)((long)puVar36 + 4),pBVar34 + (ulong)uVar47 + 4,
                                    (BYTE *)iEnd,pBVar34 + uVar44,pBVar31 + uVar44);
                pBVar24 = (BYTE *)(sVar22 + 4);
              }
              else {
LAB_00203005:
                pBVar24 = (BYTE *)0x0;
              }
            }
            else {
              puVar40 = (ulong *)(pBVar31 + uVar47);
              if (pBVar26[(long)puVar40] != *(BYTE *)((long)puVar36 + (long)pBVar26))
              goto LAB_00203005;
              puVar30 = puVar36;
              if (puVar36 < puVar1) {
                uVar25 = *puVar36 ^ *puVar40;
                uVar37 = 0;
                if (uVar25 != 0) {
                  for (; (uVar25 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
                  }
                }
                pBVar24 = (BYTE *)(uVar37 >> 3 & 0x1fffffff);
                if (*puVar40 == *puVar36) {
                  do {
                    puVar30 = puVar30 + 1;
                    puVar40 = puVar40 + 1;
                    if (puVar1 <= puVar30) goto LAB_00203012;
                    uVar25 = *puVar30 ^ *puVar40;
                    uVar37 = 0;
                    if (uVar25 != 0) {
                      for (; (uVar25 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
                      }
                    }
                    pBVar24 = (BYTE *)((long)puVar30 + ((uVar37 >> 3 & 0x1fffffff) - (long)puVar36))
                    ;
                  } while (*puVar40 == *puVar30);
                }
              }
              else {
LAB_00203012:
                if ((puVar30 < puVar2) && ((int)*puVar40 == (int)*puVar30)) {
                  puVar30 = (ulong *)((long)puVar30 + 4);
                  puVar40 = (ulong *)((long)puVar40 + 4);
                }
                if ((puVar30 < puVar3) && ((short)*puVar40 == (short)*puVar30)) {
                  puVar30 = (ulong *)((long)puVar30 + 2);
                  puVar40 = (ulong *)((long)puVar40 + 2);
                }
                if (puVar30 < iEnd) {
                  puVar30 = (ulong *)((long)puVar30 + (ulong)((BYTE)*puVar40 == (BYTE)*puVar30));
                }
                pBVar24 = (BYTE *)((long)puVar30 - (long)puVar36);
              }
            }
            pBVar49 = pBVar26;
            if (pBVar26 < pBVar24) {
              pBVar49 = pBVar24;
              uVar23 = (ulong)((uVar32 + 2) - uVar47);
            }
          } while ((pBVar24 <= pBVar26 || (ulong *)((long)puVar36 + (long)pBVar24) != iEnd) &&
                  (uVar50 = uVar50 + 1, pBVar26 = pBVar49, uVar50 < uVar46));
        }
        else {
          pBVar31 = (ms->window).base;
          pBVar34 = (ms->window).dictBase;
          uVar44 = (ms->window).dictLimit;
          uVar23 = (long)puVar36 - (long)pBVar31;
          uVar39 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
          uVar32 = (uint)uVar23;
          uVar45 = uVar32 - uVar39;
          if (uVar32 - uVar47 <= uVar39) {
            uVar45 = uVar47;
          }
          pUVar12 = ms->hashTable;
          if (UVar48 != 0) {
            uVar45 = uVar47;
          }
          if (3 < uVar29) {
            uVar29 = 4;
          }
          iVar43 = 1 << ((byte)uVar29 & 0x1f);
          pUVar13 = ms->tagTable;
          uVar46 = (ulong)ms->nextToUpdate;
          cVar58 = (char)ms->rowHashLog;
          if (ms->nextToUpdate < uVar32) {
            do {
              uVar29 = (uint)uVar46 & 7;
              uVar47 = ms->hashCache[uVar29];
              ms->hashCache[uVar29] =
                   (uint)(*(int *)(pBVar31 + uVar46 + 8) * -0x61c8864f) >> (0x18U - cVar58 & 0x1f);
              uVar50 = (ulong)(uVar47 >> 4 & 0xfffffff0);
              uVar29 = (byte)((char)pUVar13[uVar50] - 1) & 0xf;
              *(char *)(pUVar13 + uVar50) = (char)uVar29;
              *(char *)((long)pUVar13 + (ulong)uVar29 + 1 + uVar50 * 2) = (char)uVar47;
              pUVar12[uVar50 + uVar29] = (uint)uVar46;
              uVar46 = uVar46 + 1;
            } while (uVar46 < (uVar23 & 0xffffffff));
          }
          ms->nextToUpdate = uVar32;
          uVar47 = ms->hashCache[uVar32 & 7];
          ms->hashCache[uVar32 & 7] =
               (uint)(*(int *)(pBVar31 + (uVar23 & 0xffffffff) + 8) * -0x61c8864f) >>
               (0x18U - cVar58 & 0x1f);
          uVar23 = (ulong)(uVar47 >> 4 & 0xfffffff0);
          bVar8 = (byte)pUVar13[uVar23];
          pcVar6 = (char *)((long)pUVar13 + uVar23 * 2 + 1);
          uVar80 = (undefined1)(uVar47 >> 0x18);
          uVar78 = (undefined1)(uVar47 >> 0x10);
          uVar76 = (undefined1)(uVar47 >> 8);
          auVar83._4_4_ =
               (int)(CONCAT35(CONCAT21(CONCAT11(uVar80,uVar80),uVar78),CONCAT14(uVar78,uVar47)) >>
                    0x20);
          auVar83[3] = uVar76;
          auVar83[2] = uVar76;
          auVar83[0] = (undefined1)uVar47;
          auVar83[1] = auVar83[0];
          auVar83._8_8_ = 0;
          auVar65 = pshuflw(auVar83,auVar83,0);
          cVar58 = auVar65[0];
          auVar66[0] = -(cVar58 == *pcVar6);
          cVar77 = auVar65[1];
          auVar66[1] = -(cVar77 == pcVar6[1]);
          cVar79 = auVar65[2];
          auVar66[2] = -(cVar79 == pcVar6[2]);
          cVar81 = auVar65[3];
          auVar66[3] = -(cVar81 == pcVar6[3]);
          auVar66[4] = -(cVar58 == pcVar6[4]);
          auVar66[5] = -(cVar77 == pcVar6[5]);
          auVar66[6] = -(cVar79 == pcVar6[6]);
          auVar66[7] = -(cVar81 == pcVar6[7]);
          auVar66[8] = -(cVar58 == pcVar6[8]);
          auVar66[9] = -(cVar77 == pcVar6[9]);
          auVar66[10] = -(cVar79 == pcVar6[10]);
          auVar66[0xb] = -(cVar81 == pcVar6[0xb]);
          auVar66[0xc] = -(cVar58 == pcVar6[0xc]);
          auVar66[0xd] = -(cVar77 == pcVar6[0xd]);
          auVar66[0xe] = -(cVar79 == pcVar6[0xe]);
          auVar66[0xf] = -(cVar81 == pcVar6[0xf]);
          uVar16 = (ushort)(SUB161(auVar66 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar66 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar66 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar66 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar66 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar66 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar66 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar66 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar66 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar66 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar66 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar66 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar66 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar66 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar66 >> 0x77,0) & 1) << 0xe |
                   (ushort)(auVar66[0xf] >> 7) << 0xf;
          uVar47 = (uint)uVar16;
          if ((bVar8 & 0xf) != 0) {
            uVar47 = (uint)uVar16 << (0x10 - (bVar8 & 0xf) & 0x1f) & 0xfffe |
                     (uint)(uVar16 >> (bVar8 & 0xf));
          }
          if (uVar47 == 0) {
            uVar46 = 0;
          }
          else {
            uVar46 = 0;
            while( true ) {
              iVar43 = iVar43 + -1;
              iVar15 = 0;
              if (uVar47 != 0) {
                for (; (uVar47 >> iVar15 & 1) == 0; iVar15 = iVar15 + 1) {
                }
              }
              if (pUVar12[uVar23 + (iVar15 + (uint)bVar8 & 0xf)] < uVar45) break;
              auStack_b8[uVar46] = pUVar12[uVar23 + (iVar15 + (uint)bVar8 & 0xf)];
              uVar46 = uVar46 + 1;
              uVar47 = uVar47 & uVar47 - 1;
              if ((uVar47 == 0) || (iVar43 == 0)) break;
            }
          }
          uVar47 = bVar8 - 1 & 0xf;
          *(char *)(pUVar13 + uVar23) = (char)uVar47;
          *(undefined1 *)((long)(pUVar13 + uVar23) + (ulong)uVar47 + 1) = auVar83[0];
          UVar48 = ms->nextToUpdate;
          ms->nextToUpdate = UVar48 + 1;
          pUVar12[uVar23 + uVar47] = UVar48;
          if (uVar46 == 0) goto LAB_0020342a;
          uVar23 = 999999999;
          uVar50 = 0;
          pBVar26 = (BYTE *)0x3;
          do {
            uVar47 = auStack_b8[uVar50];
            if (uVar47 < uVar44) {
              if (*(int *)(pBVar34 + uVar47) == (int)*puVar36) {
                sVar22 = ZSTD_count_2segments
                                   ((BYTE *)((long)puVar36 + 4),pBVar34 + (ulong)uVar47 + 4,
                                    (BYTE *)iEnd,pBVar34 + uVar44,pBVar31 + uVar44);
                pBVar24 = (BYTE *)(sVar22 + 4);
              }
              else {
LAB_002033a5:
                pBVar24 = (BYTE *)0x0;
              }
            }
            else {
              puVar40 = (ulong *)(pBVar31 + uVar47);
              if (pBVar26[(long)puVar40] != *(BYTE *)((long)puVar36 + (long)pBVar26))
              goto LAB_002033a5;
              puVar30 = puVar36;
              if (puVar36 < puVar1) {
                uVar25 = *puVar36 ^ *puVar40;
                uVar37 = 0;
                if (uVar25 != 0) {
                  for (; (uVar25 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
                  }
                }
                pBVar24 = (BYTE *)(uVar37 >> 3 & 0x1fffffff);
                if (*puVar40 == *puVar36) {
                  do {
                    puVar30 = puVar30 + 1;
                    puVar40 = puVar40 + 1;
                    if (puVar1 <= puVar30) goto LAB_002033b2;
                    uVar25 = *puVar30 ^ *puVar40;
                    uVar37 = 0;
                    if (uVar25 != 0) {
                      for (; (uVar25 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
                      }
                    }
                    pBVar24 = (BYTE *)((long)puVar30 + ((uVar37 >> 3 & 0x1fffffff) - (long)puVar36))
                    ;
                  } while (*puVar40 == *puVar30);
                }
              }
              else {
LAB_002033b2:
                if ((puVar30 < puVar2) && ((int)*puVar40 == (int)*puVar30)) {
                  puVar30 = (ulong *)((long)puVar30 + 4);
                  puVar40 = (ulong *)((long)puVar40 + 4);
                }
                if ((puVar30 < puVar3) && ((short)*puVar40 == (short)*puVar30)) {
                  puVar30 = (ulong *)((long)puVar30 + 2);
                  puVar40 = (ulong *)((long)puVar40 + 2);
                }
                if (puVar30 < iEnd) {
                  puVar30 = (ulong *)((long)puVar30 + (ulong)((BYTE)*puVar40 == (BYTE)*puVar30));
                }
                pBVar24 = (BYTE *)((long)puVar30 - (long)puVar36);
              }
            }
            pBVar49 = pBVar26;
            if (pBVar26 < pBVar24) {
              pBVar49 = pBVar24;
              uVar23 = (ulong)((uVar32 + 2) - uVar47);
            }
          } while ((pBVar24 <= pBVar26 || (ulong *)((long)puVar36 + (long)pBVar24) != iEnd) &&
                  (uVar50 = uVar50 + 1, pBVar26 = pBVar49, uVar50 < uVar46));
        }
      }
      else if (uVar44 - 6 < 2) {
        pBVar31 = (ms->window).base;
        pBVar34 = (ms->window).dictBase;
        uVar29 = (ms->window).dictLimit;
        uVar23 = (long)puVar36 - (long)pBVar31;
        uVar32 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
        uVar45 = (uint)uVar23;
        uVar44 = uVar45 - uVar32;
        if (uVar45 - uVar47 <= uVar32) {
          uVar44 = uVar47;
        }
        pUVar12 = ms->hashTable;
        pUVar13 = ms->tagTable;
        if (UVar48 != 0) {
          uVar44 = uVar47;
        }
        uVar46 = (ulong)ms->nextToUpdate;
        cVar58 = (char)ms->rowHashLog;
        if (ms->nextToUpdate < uVar45) {
          do {
            uVar32 = (uint)uVar46 & 7;
            uVar47 = ms->hashCache[uVar32];
            ms->hashCache[uVar32] =
                 (U32)((ulong)(*(long *)(pBVar31 + uVar46 + 8) * -0x30e4432340650000) >>
                      (0x38U - cVar58 & 0x3f));
            uVar50 = (ulong)(uVar47 >> 3 & 0xffffffe0);
            uVar32 = (byte)((char)pUVar13[uVar50] - 1) & 0x1f;
            *(char *)(pUVar13 + uVar50) = (char)uVar32;
            *(char *)((long)pUVar13 + (ulong)uVar32 + 1 + uVar50 * 2) = (char)uVar47;
            pUVar12[uVar50 + uVar32] = (uint)uVar46;
            uVar46 = uVar46 + 1;
          } while (uVar46 < (uVar23 & 0xffffffff));
        }
        ms->nextToUpdate = uVar45;
        uVar47 = ms->hashCache[uVar45 & 7];
        ms->hashCache[uVar45 & 7] =
             (U32)((ulong)(*(long *)(pBVar31 + (uVar23 & 0xffffffff) + 8) * -0x30e4432340650000) >>
                  (0x38U - cVar58 & 0x3f));
        uVar23 = (ulong)(uVar47 >> 3 & 0xffffffe0);
        bVar8 = (byte)pUVar13[uVar23];
        pcVar6 = (char *)((long)pUVar13 + uVar23 * 2 + 1);
        pcVar7 = (char *)((long)pUVar13 + uVar23 * 2 + 0x11);
        uVar80 = (undefined1)(uVar47 >> 0x18);
        uVar78 = (undefined1)(uVar47 >> 0x10);
        uVar76 = (undefined1)(uVar47 >> 8);
        auVar82._4_4_ =
             (int)(CONCAT35(CONCAT21(CONCAT11(uVar80,uVar80),uVar78),CONCAT14(uVar78,uVar47)) >>
                  0x20);
        auVar82[3] = uVar76;
        auVar82[2] = uVar76;
        auVar82[0] = (undefined1)uVar47;
        auVar82[1] = auVar82[0];
        auVar82._8_8_ = 0;
        auVar83 = pshuflw(auVar82,auVar82,0);
        cVar58 = auVar83[0];
        auVar52[0] = -(*pcVar6 == cVar58);
        cVar77 = auVar83[1];
        auVar52[1] = -(pcVar6[1] == cVar77);
        cVar79 = auVar83[2];
        auVar52[2] = -(pcVar6[2] == cVar79);
        cVar81 = auVar83[3];
        auVar52[3] = -(pcVar6[3] == cVar81);
        auVar52[4] = -(pcVar6[4] == cVar58);
        auVar52[5] = -(pcVar6[5] == cVar77);
        auVar52[6] = -(pcVar6[6] == cVar79);
        auVar52[7] = -(pcVar6[7] == cVar81);
        auVar52[8] = -(pcVar6[8] == cVar58);
        auVar52[9] = -(pcVar6[9] == cVar77);
        auVar52[10] = -(pcVar6[10] == cVar79);
        auVar52[0xb] = -(pcVar6[0xb] == cVar81);
        auVar52[0xc] = -(pcVar6[0xc] == cVar58);
        auVar52[0xd] = -(pcVar6[0xd] == cVar77);
        auVar52[0xe] = -(pcVar6[0xe] == cVar79);
        auVar52[0xf] = -(pcVar6[0xf] == cVar81);
        auVar59[0] = -(*pcVar7 == cVar58);
        auVar59[1] = -(pcVar7[1] == cVar77);
        auVar59[2] = -(pcVar7[2] == cVar79);
        auVar59[3] = -(pcVar7[3] == cVar81);
        auVar59[4] = -(pcVar7[4] == cVar58);
        auVar59[5] = -(pcVar7[5] == cVar77);
        auVar59[6] = -(pcVar7[6] == cVar79);
        auVar59[7] = -(pcVar7[7] == cVar81);
        auVar59[8] = -(pcVar7[8] == cVar58);
        auVar59[9] = -(pcVar7[9] == cVar77);
        auVar59[10] = -(pcVar7[10] == cVar79);
        auVar59[0xb] = -(pcVar7[0xb] == cVar81);
        auVar59[0xc] = -(pcVar7[0xc] == cVar58);
        auVar59[0xd] = -(pcVar7[0xd] == cVar77);
        auVar59[0xe] = -(pcVar7[0xe] == cVar79);
        auVar59[0xf] = -(pcVar7[0xf] == cVar81);
        uVar32 = CONCAT22((ushort)(SUB161(auVar59 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar59 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar59 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar59 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar59 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar59 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar59 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar59 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar59 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar59 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar59 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar59 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar59 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar59 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar59 >> 0x77,0) & 1) << 0xe |
                          (ushort)(auVar59[0xf] >> 7) << 0xf,
                          (ushort)(SUB161(auVar52 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar52 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar52 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar52 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar52 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar52 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar52 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar52 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar52 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar52 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar52 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar52 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar52 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar52 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar52 >> 0x77,0) & 1) << 0xe |
                          (ushort)(auVar52[0xf] >> 7) << 0xf);
        uVar47 = uVar32 >> (bVar8 & 0x1f) | uVar32 << 0x20 - (bVar8 & 0x1f);
        if ((bVar8 & 0x1f) == 0) {
          uVar47 = uVar32;
        }
        if (uVar47 == 0) {
          uVar46 = 0;
        }
        else {
          uVar46 = 0;
          iVar43 = -0x1f;
          while( true ) {
            iVar15 = 0;
            if (uVar47 != 0) {
              for (; (uVar47 >> iVar15 & 1) == 0; iVar15 = iVar15 + 1) {
              }
            }
            if (pUVar12[uVar23 + (iVar15 + (uint)bVar8 & 0x1f)] < uVar44) break;
            auStack_b8[uVar46] = pUVar12[uVar23 + (iVar15 + (uint)bVar8 & 0x1f)];
            uVar46 = uVar46 + 1;
            uVar47 = uVar47 & uVar47 - 1;
            if ((uVar47 == 0) || (bVar51 = iVar43 == 0, iVar43 = iVar43 + 1, bVar51)) break;
          }
        }
        uVar47 = bVar8 - 1 & 0x1f;
        *(char *)(pUVar13 + uVar23) = (char)uVar47;
        *(undefined1 *)((long)(pUVar13 + uVar23) + (ulong)uVar47 + 1) = auVar82[0];
        UVar48 = ms->nextToUpdate;
        ms->nextToUpdate = UVar48 + 1;
        pUVar12[uVar23 + uVar47] = UVar48;
        if (uVar46 == 0) goto LAB_0020342a;
        uVar23 = 999999999;
        uVar50 = 0;
        pBVar26 = (BYTE *)0x3;
        do {
          uVar47 = auStack_b8[uVar50];
          if (uVar47 < uVar29) {
            if (*(int *)(pBVar34 + uVar47) == (int)*puVar36) {
              sVar22 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar36 + 4),pBVar34 + (ulong)uVar47 + 4,
                                  (BYTE *)iEnd,pBVar34 + uVar29,pBVar31 + uVar29);
              pBVar24 = (BYTE *)(sVar22 + 4);
            }
            else {
LAB_00202a95:
              pBVar24 = (BYTE *)0x0;
            }
          }
          else {
            puVar40 = (ulong *)(pBVar31 + uVar47);
            if (pBVar26[(long)puVar40] != *(BYTE *)((long)puVar36 + (long)pBVar26))
            goto LAB_00202a95;
            puVar30 = puVar36;
            if (puVar36 < puVar1) {
              uVar25 = *puVar36 ^ *puVar40;
              uVar37 = 0;
              if (uVar25 != 0) {
                for (; (uVar25 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
                }
              }
              pBVar24 = (BYTE *)(uVar37 >> 3 & 0x1fffffff);
              if (*puVar40 == *puVar36) {
                do {
                  puVar30 = puVar30 + 1;
                  puVar40 = puVar40 + 1;
                  if (puVar1 <= puVar30) goto LAB_00202aa2;
                  uVar25 = *puVar30 ^ *puVar40;
                  uVar37 = 0;
                  if (uVar25 != 0) {
                    for (; (uVar25 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
                    }
                  }
                  pBVar24 = (BYTE *)((long)puVar30 + ((uVar37 >> 3 & 0x1fffffff) - (long)puVar36));
                } while (*puVar40 == *puVar30);
              }
            }
            else {
LAB_00202aa2:
              if ((puVar30 < puVar2) && ((int)*puVar40 == (int)*puVar30)) {
                puVar30 = (ulong *)((long)puVar30 + 4);
                puVar40 = (ulong *)((long)puVar40 + 4);
              }
              if ((puVar30 < puVar3) && ((short)*puVar40 == (short)*puVar30)) {
                puVar30 = (ulong *)((long)puVar30 + 2);
                puVar40 = (ulong *)((long)puVar40 + 2);
              }
              if (puVar30 < iEnd) {
                puVar30 = (ulong *)((long)puVar30 + (ulong)((BYTE)*puVar40 == (BYTE)*puVar30));
              }
              pBVar24 = (BYTE *)((long)puVar30 - (long)puVar36);
            }
          }
          pBVar49 = pBVar26;
          if (pBVar26 < pBVar24) {
            pBVar49 = pBVar24;
            uVar23 = (ulong)((uVar45 + 2) - uVar47);
          }
        } while ((pBVar24 <= pBVar26 || (ulong *)((long)puVar36 + (long)pBVar24) != iEnd) &&
                (uVar50 = uVar50 + 1, pBVar26 = pBVar49, uVar50 < uVar46));
      }
      else if (uVar44 == 5) {
        pBVar31 = (ms->window).base;
        pBVar34 = (ms->window).dictBase;
        uVar29 = (ms->window).dictLimit;
        uVar23 = (long)puVar36 - (long)pBVar31;
        uVar32 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
        uVar45 = (uint)uVar23;
        uVar44 = uVar45 - uVar32;
        if (uVar45 - uVar47 <= uVar32) {
          uVar44 = uVar47;
        }
        pUVar12 = ms->hashTable;
        pUVar13 = ms->tagTable;
        if (UVar48 != 0) {
          uVar44 = uVar47;
        }
        uVar46 = (ulong)ms->nextToUpdate;
        cVar58 = (char)ms->rowHashLog;
        if (ms->nextToUpdate < uVar45) {
          do {
            uVar32 = (uint)uVar46 & 7;
            uVar47 = ms->hashCache[uVar32];
            ms->hashCache[uVar32] =
                 (U32)((ulong)(*(long *)(pBVar31 + uVar46 + 8) * -0x30e4432345000000) >>
                      (0x38U - cVar58 & 0x3f));
            uVar50 = (ulong)(uVar47 >> 3 & 0xffffffe0);
            uVar32 = (byte)((char)pUVar13[uVar50] - 1) & 0x1f;
            *(char *)(pUVar13 + uVar50) = (char)uVar32;
            *(char *)((long)pUVar13 + (ulong)uVar32 + 1 + uVar50 * 2) = (char)uVar47;
            pUVar12[uVar50 + uVar32] = (uint)uVar46;
            uVar46 = uVar46 + 1;
          } while (uVar46 < (uVar23 & 0xffffffff));
        }
        ms->nextToUpdate = uVar45;
        uVar47 = ms->hashCache[uVar45 & 7];
        ms->hashCache[uVar45 & 7] =
             (U32)((ulong)(*(long *)(pBVar31 + (uVar23 & 0xffffffff) + 8) * -0x30e4432345000000) >>
                  (0x38U - cVar58 & 0x3f));
        uVar23 = (ulong)(uVar47 >> 3 & 0xffffffe0);
        bVar8 = (byte)pUVar13[uVar23];
        pcVar6 = (char *)((long)pUVar13 + uVar23 * 2 + 1);
        pcVar7 = (char *)((long)pUVar13 + uVar23 * 2 + 0x11);
        uVar80 = (undefined1)(uVar47 >> 0x18);
        uVar78 = (undefined1)(uVar47 >> 0x10);
        uVar76 = (undefined1)(uVar47 >> 8);
        auVar84._4_4_ =
             (int)(CONCAT35(CONCAT21(CONCAT11(uVar80,uVar80),uVar78),CONCAT14(uVar78,uVar47)) >>
                  0x20);
        auVar84[3] = uVar76;
        auVar84[2] = uVar76;
        auVar84[0] = (undefined1)uVar47;
        auVar84[1] = auVar84[0];
        auVar84._8_8_ = 0;
        auVar83 = pshuflw(auVar84,auVar84,0);
        cVar58 = auVar83[0];
        auVar53[0] = -(*pcVar6 == cVar58);
        cVar77 = auVar83[1];
        auVar53[1] = -(pcVar6[1] == cVar77);
        cVar79 = auVar83[2];
        auVar53[2] = -(pcVar6[2] == cVar79);
        cVar81 = auVar83[3];
        auVar53[3] = -(pcVar6[3] == cVar81);
        auVar53[4] = -(pcVar6[4] == cVar58);
        auVar53[5] = -(pcVar6[5] == cVar77);
        auVar53[6] = -(pcVar6[6] == cVar79);
        auVar53[7] = -(pcVar6[7] == cVar81);
        auVar53[8] = -(pcVar6[8] == cVar58);
        auVar53[9] = -(pcVar6[9] == cVar77);
        auVar53[10] = -(pcVar6[10] == cVar79);
        auVar53[0xb] = -(pcVar6[0xb] == cVar81);
        auVar53[0xc] = -(pcVar6[0xc] == cVar58);
        auVar53[0xd] = -(pcVar6[0xd] == cVar77);
        auVar53[0xe] = -(pcVar6[0xe] == cVar79);
        auVar53[0xf] = -(pcVar6[0xf] == cVar81);
        auVar62[0] = -(*pcVar7 == cVar58);
        auVar62[1] = -(pcVar7[1] == cVar77);
        auVar62[2] = -(pcVar7[2] == cVar79);
        auVar62[3] = -(pcVar7[3] == cVar81);
        auVar62[4] = -(pcVar7[4] == cVar58);
        auVar62[5] = -(pcVar7[5] == cVar77);
        auVar62[6] = -(pcVar7[6] == cVar79);
        auVar62[7] = -(pcVar7[7] == cVar81);
        auVar62[8] = -(pcVar7[8] == cVar58);
        auVar62[9] = -(pcVar7[9] == cVar77);
        auVar62[10] = -(pcVar7[10] == cVar79);
        auVar62[0xb] = -(pcVar7[0xb] == cVar81);
        auVar62[0xc] = -(pcVar7[0xc] == cVar58);
        auVar62[0xd] = -(pcVar7[0xd] == cVar77);
        auVar62[0xe] = -(pcVar7[0xe] == cVar79);
        auVar62[0xf] = -(pcVar7[0xf] == cVar81);
        uVar32 = CONCAT22((ushort)(SUB161(auVar62 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar62 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar62 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar62 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar62 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar62 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar62 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar62 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar62 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar62 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar62 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar62 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar62 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar62 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar62 >> 0x77,0) & 1) << 0xe |
                          (ushort)(auVar62[0xf] >> 7) << 0xf,
                          (ushort)(SUB161(auVar53 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar53 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar53 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar53 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar53 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar53 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar53 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar53 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar53 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar53 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar53 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar53 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar53 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar53 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar53 >> 0x77,0) & 1) << 0xe |
                          (ushort)(auVar53[0xf] >> 7) << 0xf);
        uVar47 = uVar32 >> (bVar8 & 0x1f) | uVar32 << 0x20 - (bVar8 & 0x1f);
        if ((bVar8 & 0x1f) == 0) {
          uVar47 = uVar32;
        }
        if (uVar47 == 0) {
          uVar46 = 0;
        }
        else {
          uVar46 = 0;
          iVar43 = -0x1f;
          while( true ) {
            iVar15 = 0;
            if (uVar47 != 0) {
              for (; (uVar47 >> iVar15 & 1) == 0; iVar15 = iVar15 + 1) {
              }
            }
            if (pUVar12[uVar23 + (iVar15 + (uint)bVar8 & 0x1f)] < uVar44) break;
            auStack_b8[uVar46] = pUVar12[uVar23 + (iVar15 + (uint)bVar8 & 0x1f)];
            uVar46 = uVar46 + 1;
            uVar47 = uVar47 & uVar47 - 1;
            if ((uVar47 == 0) || (bVar51 = iVar43 == 0, iVar43 = iVar43 + 1, bVar51)) break;
          }
        }
        uVar47 = bVar8 - 1 & 0x1f;
        *(char *)(pUVar13 + uVar23) = (char)uVar47;
        *(undefined1 *)((long)(pUVar13 + uVar23) + (ulong)uVar47 + 1) = auVar84[0];
        UVar48 = ms->nextToUpdate;
        ms->nextToUpdate = UVar48 + 1;
        pUVar12[uVar23 + uVar47] = UVar48;
        if (uVar46 == 0) {
LAB_0020342a:
          pBVar49 = (BYTE *)0x3;
          uVar23 = 999999999;
        }
        else {
          uVar23 = 999999999;
          uVar50 = 0;
          pBVar26 = (BYTE *)0x3;
          do {
            uVar47 = auStack_b8[uVar50];
            if (uVar47 < uVar29) {
              if (*(int *)(pBVar34 + uVar47) == (int)*puVar36) {
                sVar22 = ZSTD_count_2segments
                                   ((BYTE *)((long)puVar36 + 4),pBVar34 + (ulong)uVar47 + 4,
                                    (BYTE *)iEnd,pBVar34 + uVar29,pBVar31 + uVar29);
                pBVar24 = (BYTE *)(sVar22 + 4);
              }
              else {
LAB_00202e35:
                pBVar24 = (BYTE *)0x0;
              }
            }
            else {
              puVar40 = (ulong *)(pBVar31 + uVar47);
              if (pBVar26[(long)puVar40] != *(BYTE *)((long)puVar36 + (long)pBVar26))
              goto LAB_00202e35;
              puVar30 = puVar36;
              if (puVar36 < puVar1) {
                uVar25 = *puVar36 ^ *puVar40;
                uVar37 = 0;
                if (uVar25 != 0) {
                  for (; (uVar25 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
                  }
                }
                pBVar24 = (BYTE *)(uVar37 >> 3 & 0x1fffffff);
                if (*puVar40 == *puVar36) {
                  do {
                    puVar30 = puVar30 + 1;
                    puVar40 = puVar40 + 1;
                    if (puVar1 <= puVar30) goto LAB_00202e42;
                    uVar25 = *puVar30 ^ *puVar40;
                    uVar37 = 0;
                    if (uVar25 != 0) {
                      for (; (uVar25 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
                      }
                    }
                    pBVar24 = (BYTE *)((long)puVar30 + ((uVar37 >> 3 & 0x1fffffff) - (long)puVar36))
                    ;
                  } while (*puVar40 == *puVar30);
                }
              }
              else {
LAB_00202e42:
                if ((puVar30 < puVar2) && ((int)*puVar40 == (int)*puVar30)) {
                  puVar30 = (ulong *)((long)puVar30 + 4);
                  puVar40 = (ulong *)((long)puVar40 + 4);
                }
                if ((puVar30 < puVar3) && ((short)*puVar40 == (short)*puVar30)) {
                  puVar30 = (ulong *)((long)puVar30 + 2);
                  puVar40 = (ulong *)((long)puVar40 + 2);
                }
                if (puVar30 < iEnd) {
                  puVar30 = (ulong *)((long)puVar30 + (ulong)((BYTE)*puVar40 == (BYTE)*puVar30));
                }
                pBVar24 = (BYTE *)((long)puVar30 - (long)puVar36);
              }
            }
            pBVar49 = pBVar26;
            if (pBVar26 < pBVar24) {
              pBVar49 = pBVar24;
              uVar23 = (ulong)((uVar45 + 2) - uVar47);
            }
          } while ((pBVar24 <= pBVar26 || (ulong *)((long)puVar36 + (long)pBVar24) != iEnd) &&
                  (uVar50 = uVar50 + 1, pBVar26 = pBVar49, uVar50 < uVar46));
        }
      }
      else {
        pBVar31 = (ms->window).base;
        pBVar34 = (ms->window).dictBase;
        uVar29 = (ms->window).dictLimit;
        uVar23 = (long)puVar36 - (long)pBVar31;
        uVar32 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
        uVar45 = (uint)uVar23;
        uVar44 = uVar45 - uVar32;
        if (uVar45 - uVar47 <= uVar32) {
          uVar44 = uVar47;
        }
        pUVar12 = ms->hashTable;
        pUVar13 = ms->tagTable;
        if (UVar48 != 0) {
          uVar44 = uVar47;
        }
        uVar46 = (ulong)ms->nextToUpdate;
        cVar58 = (char)ms->rowHashLog;
        if (ms->nextToUpdate < uVar45) {
          do {
            uVar32 = (uint)uVar46 & 7;
            uVar47 = ms->hashCache[uVar32];
            ms->hashCache[uVar32] =
                 (uint)(*(int *)(pBVar31 + uVar46 + 8) * -0x61c8864f) >> (0x18U - cVar58 & 0x1f);
            uVar50 = (ulong)(uVar47 >> 3 & 0xffffffe0);
            uVar32 = (byte)((char)pUVar13[uVar50] - 1) & 0x1f;
            *(char *)(pUVar13 + uVar50) = (char)uVar32;
            *(char *)((long)pUVar13 + (ulong)uVar32 + 1 + uVar50 * 2) = (char)uVar47;
            pUVar12[uVar50 + uVar32] = (uint)uVar46;
            uVar46 = uVar46 + 1;
          } while (uVar46 < (uVar23 & 0xffffffff));
        }
        ms->nextToUpdate = uVar45;
        uVar47 = ms->hashCache[uVar45 & 7];
        ms->hashCache[uVar45 & 7] =
             (uint)(*(int *)(pBVar31 + (uVar23 & 0xffffffff) + 8) * -0x61c8864f) >>
             (0x18U - cVar58 & 0x1f);
        uVar23 = (ulong)(uVar47 >> 3 & 0xffffffe0);
        bVar8 = (byte)pUVar13[uVar23];
        pcVar6 = (char *)((long)pUVar13 + uVar23 * 2 + 1);
        pcVar7 = (char *)((long)pUVar13 + uVar23 * 2 + 0x11);
        uVar80 = (undefined1)(uVar47 >> 0x18);
        uVar78 = (undefined1)(uVar47 >> 0x10);
        uVar76 = (undefined1)(uVar47 >> 8);
        auVar85._4_4_ =
             (int)(CONCAT35(CONCAT21(CONCAT11(uVar80,uVar80),uVar78),CONCAT14(uVar78,uVar47)) >>
                  0x20);
        auVar85[3] = uVar76;
        auVar85[2] = uVar76;
        auVar85[0] = (undefined1)uVar47;
        auVar85[1] = auVar85[0];
        auVar85._8_8_ = 0;
        auVar83 = pshuflw(auVar85,auVar85,0);
        cVar58 = auVar83[0];
        auVar54[0] = -(*pcVar6 == cVar58);
        cVar77 = auVar83[1];
        auVar54[1] = -(pcVar6[1] == cVar77);
        cVar79 = auVar83[2];
        auVar54[2] = -(pcVar6[2] == cVar79);
        cVar81 = auVar83[3];
        auVar54[3] = -(pcVar6[3] == cVar81);
        auVar54[4] = -(pcVar6[4] == cVar58);
        auVar54[5] = -(pcVar6[5] == cVar77);
        auVar54[6] = -(pcVar6[6] == cVar79);
        auVar54[7] = -(pcVar6[7] == cVar81);
        auVar54[8] = -(pcVar6[8] == cVar58);
        auVar54[9] = -(pcVar6[9] == cVar77);
        auVar54[10] = -(pcVar6[10] == cVar79);
        auVar54[0xb] = -(pcVar6[0xb] == cVar81);
        auVar54[0xc] = -(pcVar6[0xc] == cVar58);
        auVar54[0xd] = -(pcVar6[0xd] == cVar77);
        auVar54[0xe] = -(pcVar6[0xe] == cVar79);
        auVar54[0xf] = -(pcVar6[0xf] == cVar81);
        auVar64[0] = -(*pcVar7 == cVar58);
        auVar64[1] = -(pcVar7[1] == cVar77);
        auVar64[2] = -(pcVar7[2] == cVar79);
        auVar64[3] = -(pcVar7[3] == cVar81);
        auVar64[4] = -(pcVar7[4] == cVar58);
        auVar64[5] = -(pcVar7[5] == cVar77);
        auVar64[6] = -(pcVar7[6] == cVar79);
        auVar64[7] = -(pcVar7[7] == cVar81);
        auVar64[8] = -(pcVar7[8] == cVar58);
        auVar64[9] = -(pcVar7[9] == cVar77);
        auVar64[10] = -(pcVar7[10] == cVar79);
        auVar64[0xb] = -(pcVar7[0xb] == cVar81);
        auVar64[0xc] = -(pcVar7[0xc] == cVar58);
        auVar64[0xd] = -(pcVar7[0xd] == cVar77);
        auVar64[0xe] = -(pcVar7[0xe] == cVar79);
        auVar64[0xf] = -(pcVar7[0xf] == cVar81);
        uVar32 = CONCAT22((ushort)(SUB161(auVar64 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar64 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar64 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar64 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar64 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar64 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar64 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar64 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar64 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar64 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar64 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar64 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar64 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar64 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar64 >> 0x77,0) & 1) << 0xe |
                          (ushort)(auVar64[0xf] >> 7) << 0xf,
                          (ushort)(SUB161(auVar54 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar54 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar54 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar54 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar54 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar54 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar54 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar54 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar54 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar54 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar54 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar54 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar54 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar54 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar54 >> 0x77,0) & 1) << 0xe |
                          (ushort)(auVar54[0xf] >> 7) << 0xf);
        uVar47 = uVar32 >> (bVar8 & 0x1f) | uVar32 << 0x20 - (bVar8 & 0x1f);
        if ((bVar8 & 0x1f) == 0) {
          uVar47 = uVar32;
        }
        if (uVar47 == 0) {
          uVar46 = 0;
        }
        else {
          uVar46 = 0;
          iVar43 = -0x1f;
          while( true ) {
            iVar15 = 0;
            if (uVar47 != 0) {
              for (; (uVar47 >> iVar15 & 1) == 0; iVar15 = iVar15 + 1) {
              }
            }
            if (pUVar12[uVar23 + (iVar15 + (uint)bVar8 & 0x1f)] < uVar44) break;
            auStack_b8[uVar46] = pUVar12[uVar23 + (iVar15 + (uint)bVar8 & 0x1f)];
            uVar46 = uVar46 + 1;
            uVar47 = uVar47 & uVar47 - 1;
            if ((uVar47 == 0) || (bVar51 = iVar43 == 0, iVar43 = iVar43 + 1, bVar51)) break;
          }
        }
        uVar47 = bVar8 - 1 & 0x1f;
        *(char *)(pUVar13 + uVar23) = (char)uVar47;
        *(undefined1 *)((long)(pUVar13 + uVar23) + (ulong)uVar47 + 1) = auVar85[0];
        UVar48 = ms->nextToUpdate;
        ms->nextToUpdate = UVar48 + 1;
        pUVar12[uVar23 + uVar47] = UVar48;
        if (uVar46 == 0) goto LAB_0020342a;
        uVar23 = 999999999;
        uVar50 = 0;
        pBVar26 = (BYTE *)0x3;
        do {
          uVar47 = auStack_b8[uVar50];
          if (uVar47 < uVar29) {
            if (*(int *)(pBVar34 + uVar47) == (int)*puVar36) {
              sVar22 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar36 + 4),pBVar34 + (ulong)uVar47 + 4,
                                  (BYTE *)iEnd,pBVar34 + uVar29,pBVar31 + uVar29);
              pBVar24 = (BYTE *)(sVar22 + 4);
            }
            else {
LAB_002031d5:
              pBVar24 = (BYTE *)0x0;
            }
          }
          else {
            puVar40 = (ulong *)(pBVar31 + uVar47);
            if (pBVar26[(long)puVar40] != *(BYTE *)((long)puVar36 + (long)pBVar26))
            goto LAB_002031d5;
            puVar30 = puVar36;
            if (puVar36 < puVar1) {
              uVar25 = *puVar36 ^ *puVar40;
              uVar37 = 0;
              if (uVar25 != 0) {
                for (; (uVar25 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
                }
              }
              pBVar24 = (BYTE *)(uVar37 >> 3 & 0x1fffffff);
              if (*puVar40 == *puVar36) {
                do {
                  puVar30 = puVar30 + 1;
                  puVar40 = puVar40 + 1;
                  if (puVar1 <= puVar30) goto LAB_002031e2;
                  uVar25 = *puVar30 ^ *puVar40;
                  uVar37 = 0;
                  if (uVar25 != 0) {
                    for (; (uVar25 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
                    }
                  }
                  pBVar24 = (BYTE *)((long)puVar30 + ((uVar37 >> 3 & 0x1fffffff) - (long)puVar36));
                } while (*puVar40 == *puVar30);
              }
            }
            else {
LAB_002031e2:
              if ((puVar30 < puVar2) && ((int)*puVar40 == (int)*puVar30)) {
                puVar30 = (ulong *)((long)puVar30 + 4);
                puVar40 = (ulong *)((long)puVar40 + 4);
              }
              if ((puVar30 < puVar3) && ((short)*puVar40 == (short)*puVar30)) {
                puVar30 = (ulong *)((long)puVar30 + 2);
                puVar40 = (ulong *)((long)puVar40 + 2);
              }
              if (puVar30 < iEnd) {
                puVar30 = (ulong *)((long)puVar30 + (ulong)((BYTE)*puVar40 == (BYTE)*puVar30));
              }
              pBVar24 = (BYTE *)((long)puVar30 - (long)puVar36);
            }
          }
          pBVar49 = pBVar26;
          if (pBVar26 < pBVar24) {
            pBVar49 = pBVar24;
            uVar23 = (ulong)((uVar45 + 2) - uVar47);
          }
        } while ((pBVar24 <= pBVar26 || (ulong *)((long)puVar36 + (long)pBVar24) != iEnd) &&
                (uVar50 = uVar50 + 1, pBVar26 = pBVar49, uVar50 < uVar46));
      }
      local_160 = pBVar21;
      if (pBVar21 < pBVar49) {
        local_160 = pBVar49;
      }
      if (local_160 < (BYTE *)0x4) {
        puVar36 = (ulong *)((long)puVar36 + ((long)puVar36 - (long)local_130 >> 8) + 1);
      }
      else {
        local_128 = puVar36;
        if (pBVar49 <= pBVar21) {
          uVar23 = 0;
          local_128 = (ulong *)((long)puVar36 + 1);
        }
        do {
          if (iLimit <= puVar36) break;
          puVar40 = (ulong *)((long)puVar36 + 1);
          iVar35 = iVar35 + 1;
          if (uVar23 == 0) {
            uVar23 = 0;
          }
          else {
            UVar48 = (ms->window).lowLimit;
            UVar28 = iVar35 - uVar18;
            if (iVar35 - UVar48 <= uVar18) {
              UVar28 = UVar48;
            }
            if (ms->loadedDictEnd != 0) {
              UVar28 = UVar48;
            }
            uVar47 = iVar35 - local_134;
            pBVar31 = base_00;
            if (uVar47 < uVar9) {
              pBVar31 = pBVar11;
            }
            if (((2 < iVar19 - uVar47) && (local_134 < iVar35 - UVar28)) &&
               (*(int *)puVar40 == *(int *)(pBVar31 + uVar47))) {
              puVar30 = iEnd;
              if (uVar47 < uVar9) {
                puVar30 = puVar20;
              }
              sVar22 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar36 + 5),(BYTE *)((long)(pBVar31 + uVar47) + 4)
                                  ,(BYTE *)iEnd,(BYTE *)puVar30,iStart);
              if (sVar22 < 0xfffffffffffffffc) {
                uVar29 = (int)uVar23 + 1;
                uVar47 = 0x1f;
                if (uVar29 != 0) {
                  for (; uVar29 >> uVar47 == 0; uVar47 = uVar47 - 1) {
                  }
                }
                if ((int)((uVar47 ^ 0x1f) + (int)local_160 * 3 + -0x1e) <
                    (int)(BYTE *)(sVar22 + 4) * 3) {
                  uVar23 = 0;
                  local_160 = (BYTE *)(sVar22 + 4);
                  local_128 = puVar40;
                }
              }
            }
          }
          uVar47 = (ms->cParams).searchLog;
          uVar29 = (ms->cParams).minMatch;
          if (uVar47 < 5) {
            if (uVar29 - 6 < 2) {
              pUVar12 = ms->hashTable;
              pUVar13 = ms->tagTable;
              pBVar31 = (ms->window).base;
              uVar46 = (long)puVar40 - (long)pBVar31;
              uVar32 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
              uVar29 = (ms->window).lowLimit;
              uVar45 = (uint)uVar46;
              uVar44 = uVar45 - uVar32;
              if (uVar45 - uVar29 <= uVar32) {
                uVar44 = uVar29;
              }
              if (ms->loadedDictEnd != 0) {
                uVar44 = uVar29;
              }
              if (3 < uVar47) {
                uVar47 = 4;
              }
              iVar43 = 1 << ((byte)uVar47 & 0x1f);
              pBVar21 = (ms->window).dictBase;
              uVar47 = (ms->window).dictLimit;
              uVar50 = (ulong)ms->nextToUpdate;
              local_180 = (char)ms->rowHashLog;
              if (ms->nextToUpdate < uVar45) {
                do {
                  uVar32 = (uint)uVar50 & 7;
                  uVar29 = ms->hashCache[uVar32];
                  ms->hashCache[uVar32] =
                       (U32)((ulong)(*(long *)(pBVar31 + uVar50 + 8) * -0x30e4432340650000) >>
                            (0x38U - local_180 & 0x3f));
                  uVar37 = (ulong)(uVar29 >> 4 & 0xfffffff0);
                  uVar32 = (byte)((char)pUVar13[uVar37] - 1) & 0xf;
                  *(char *)(pUVar13 + uVar37) = (char)uVar32;
                  *(char *)((long)pUVar13 + (ulong)uVar32 + 1 + uVar37 * 2) = (char)uVar29;
                  pUVar12[uVar37 + uVar32] = (uint)uVar50;
                  uVar50 = uVar50 + 1;
                } while (uVar50 < (uVar46 & 0xffffffff));
              }
              ms->nextToUpdate = uVar45;
              uVar29 = ms->hashCache[uVar45 & 7];
              ms->hashCache[uVar45 & 7] =
                   (U32)((ulong)(*(long *)(pBVar31 + (uVar46 & 0xffffffff) + 8) *
                                -0x30e4432340650000) >> (0x38U - local_180 & 0x3f));
              uVar46 = (ulong)(uVar29 >> 4 & 0xfffffff0);
              bVar8 = (byte)pUVar13[uVar46];
              pcVar6 = (char *)((long)pUVar13 + uVar46 * 2 + 1);
              uVar80 = (undefined1)(uVar29 >> 0x18);
              uVar78 = (undefined1)(uVar29 >> 0x10);
              uVar76 = (undefined1)(uVar29 >> 8);
              auVar68._4_4_ =
                   (int)(CONCAT35(CONCAT21(CONCAT11(uVar80,uVar80),uVar78),CONCAT14(uVar78,uVar29))
                        >> 0x20);
              auVar68[3] = uVar76;
              auVar68[2] = uVar76;
              auVar68[0] = (undefined1)uVar29;
              auVar68[1] = auVar68[0];
              auVar68._8_8_ = 0;
              auVar83 = pshuflw(auVar68,auVar68,0);
              cVar58 = auVar83[0];
              auVar69[0] = -(cVar58 == *pcVar6);
              cVar77 = auVar83[1];
              auVar69[1] = -(cVar77 == pcVar6[1]);
              cVar79 = auVar83[2];
              auVar69[2] = -(cVar79 == pcVar6[2]);
              cVar81 = auVar83[3];
              auVar69[3] = -(cVar81 == pcVar6[3]);
              auVar69[4] = -(cVar58 == pcVar6[4]);
              auVar69[5] = -(cVar77 == pcVar6[5]);
              auVar69[6] = -(cVar79 == pcVar6[6]);
              auVar69[7] = -(cVar81 == pcVar6[7]);
              auVar69[8] = -(cVar58 == pcVar6[8]);
              auVar69[9] = -(cVar77 == pcVar6[9]);
              auVar69[10] = -(cVar79 == pcVar6[10]);
              auVar69[0xb] = -(cVar81 == pcVar6[0xb]);
              auVar69[0xc] = -(cVar58 == pcVar6[0xc]);
              auVar69[0xd] = -(cVar77 == pcVar6[0xd]);
              auVar69[0xe] = -(cVar79 == pcVar6[0xe]);
              auVar69[0xf] = -(cVar81 == pcVar6[0xf]);
              uVar16 = (ushort)(SUB161(auVar69 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar69 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar69 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar69 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar69 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar69 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar69 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar69 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar69 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar69 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar69 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar69 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar69 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar69 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar69 >> 0x77,0) & 1) << 0xe |
                       (ushort)(auVar69[0xf] >> 7) << 0xf;
              uVar29 = (uint)uVar16;
              if ((bVar8 & 0xf) != 0) {
                uVar29 = (uint)uVar16 << (0x10 - (bVar8 & 0xf) & 0x1f) & 0xfffe |
                         (uint)(uVar16 >> (bVar8 & 0xf));
              }
              if (uVar29 == 0) {
                uVar50 = 0;
              }
              else {
                uVar50 = 0;
                while( true ) {
                  iVar43 = iVar43 + -1;
                  iVar15 = 0;
                  if (uVar29 != 0) {
                    for (; (uVar29 >> iVar15 & 1) == 0; iVar15 = iVar15 + 1) {
                    }
                  }
                  if (pUVar12[uVar46 + (iVar15 + (uint)bVar8 & 0xf)] < uVar44) break;
                  auStack_b8[uVar50] = pUVar12[uVar46 + (iVar15 + (uint)bVar8 & 0xf)];
                  uVar50 = uVar50 + 1;
                  uVar29 = uVar29 & uVar29 - 1;
                  if ((uVar29 == 0) || (iVar43 == 0)) break;
                }
              }
              uVar29 = bVar8 - 1 & 0xf;
              *(char *)(pUVar13 + uVar46) = (char)uVar29;
              *(undefined1 *)((long)(pUVar13 + uVar46) + (ulong)uVar29 + 1) = auVar68[0];
              UVar48 = ms->nextToUpdate;
              ms->nextToUpdate = UVar48 + 1;
              pUVar12[uVar46 + uVar29] = UVar48;
              if (uVar50 == 0) goto LAB_00204c8e;
              uVar46 = 999999999;
              uVar37 = 0;
              pBVar34 = (BYTE *)0x3;
              do {
                uVar29 = auStack_b8[uVar37];
                if (uVar29 < uVar47) {
                  if (*(int *)(pBVar21 + uVar29) == *(int *)puVar40) {
                    sVar22 = ZSTD_count_2segments
                                       ((BYTE *)((long)puVar36 + 5),pBVar21 + (ulong)uVar29 + 4,
                                        (BYTE *)iEnd,pBVar21 + uVar47,pBVar31 + uVar47);
                    pBVar26 = (BYTE *)(sVar22 + 4);
                  }
                  else {
LAB_002044a7:
                    pBVar26 = (BYTE *)0x0;
                  }
                }
                else {
                  puVar30 = (ulong *)(pBVar31 + uVar29);
                  if (pBVar34[(long)puVar30] != *(BYTE *)((long)puVar40 + (long)pBVar34))
                  goto LAB_002044a7;
                  puVar33 = puVar40;
                  if (puVar40 < puVar1) {
                    uVar27 = *puVar40 ^ *puVar30;
                    uVar25 = 0;
                    if (uVar27 != 0) {
                      for (; (uVar27 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                      }
                    }
                    pBVar26 = (BYTE *)(uVar25 >> 3 & 0x1fffffff);
                    puVar33 = (ulong *)((long)puVar36 + 9);
                    if (*puVar30 == *puVar40) {
                      do {
                        puVar30 = puVar30 + 1;
                        if (puVar1 <= puVar33) goto LAB_002044b4;
                        uVar25 = *puVar33;
                        uVar41 = uVar25 ^ *puVar30;
                        uVar27 = 0;
                        if (uVar41 != 0) {
                          for (; (uVar41 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                          }
                        }
                        pBVar26 = (BYTE *)((long)puVar33 +
                                          ((uVar27 >> 3 & 0x1fffffff) - (long)puVar40));
                        puVar33 = puVar33 + 1;
                      } while (*puVar30 == uVar25);
                    }
                  }
                  else {
LAB_002044b4:
                    if ((puVar33 < puVar2) && ((int)*puVar30 == (int)*puVar33)) {
                      puVar33 = (ulong *)((long)puVar33 + 4);
                      puVar30 = (ulong *)((long)puVar30 + 4);
                    }
                    if ((puVar33 < puVar3) && ((short)*puVar30 == (short)*puVar33)) {
                      puVar33 = (ulong *)((long)puVar33 + 2);
                      puVar30 = (ulong *)((long)puVar30 + 2);
                    }
                    if (puVar33 < iEnd) {
                      puVar33 = (ulong *)((long)puVar33 + (ulong)((BYTE)*puVar30 == (BYTE)*puVar33))
                      ;
                    }
                    pBVar26 = (BYTE *)((long)puVar33 - (long)puVar40);
                  }
                }
                pBVar24 = pBVar34;
                if (pBVar34 < pBVar26) {
                  pBVar24 = pBVar26;
                  uVar46 = (ulong)((uVar45 + 2) - uVar29);
                }
              } while ((pBVar26 <= pBVar34 || (ulong *)((long)puVar40 + (long)pBVar26) != iEnd) &&
                      (uVar37 = uVar37 + 1, pBVar34 = pBVar24, uVar37 < uVar50));
            }
            else if (uVar29 == 5) {
              pUVar12 = ms->hashTable;
              pUVar13 = ms->tagTable;
              pBVar31 = (ms->window).base;
              uVar46 = (long)puVar40 - (long)pBVar31;
              uVar32 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
              uVar29 = (ms->window).lowLimit;
              uVar45 = (uint)uVar46;
              uVar44 = uVar45 - uVar32;
              if (uVar45 - uVar29 <= uVar32) {
                uVar44 = uVar29;
              }
              if (ms->loadedDictEnd != 0) {
                uVar44 = uVar29;
              }
              if (3 < uVar47) {
                uVar47 = 4;
              }
              iVar43 = 1 << ((byte)uVar47 & 0x1f);
              pBVar21 = (ms->window).dictBase;
              uVar47 = (ms->window).dictLimit;
              uVar50 = (ulong)ms->nextToUpdate;
              local_180 = (char)ms->rowHashLog;
              if (ms->nextToUpdate < uVar45) {
                do {
                  uVar32 = (uint)uVar50 & 7;
                  uVar29 = ms->hashCache[uVar32];
                  ms->hashCache[uVar32] =
                       (U32)((ulong)(*(long *)(pBVar31 + uVar50 + 8) * -0x30e4432345000000) >>
                            (0x38U - local_180 & 0x3f));
                  uVar37 = (ulong)(uVar29 >> 4 & 0xfffffff0);
                  uVar32 = (byte)((char)pUVar13[uVar37] - 1) & 0xf;
                  *(char *)(pUVar13 + uVar37) = (char)uVar32;
                  *(char *)((long)pUVar13 + (ulong)uVar32 + 1 + uVar37 * 2) = (char)uVar29;
                  pUVar12[uVar37 + uVar32] = (uint)uVar50;
                  uVar50 = uVar50 + 1;
                } while (uVar50 < (uVar46 & 0xffffffff));
              }
              ms->nextToUpdate = uVar45;
              uVar29 = ms->hashCache[uVar45 & 7];
              ms->hashCache[uVar45 & 7] =
                   (U32)((ulong)(*(long *)(pBVar31 + (uVar46 & 0xffffffff) + 8) *
                                -0x30e4432345000000) >> (0x38U - local_180 & 0x3f));
              uVar46 = (ulong)(uVar29 >> 4 & 0xfffffff0);
              bVar8 = (byte)pUVar13[uVar46];
              pcVar6 = (char *)((long)pUVar13 + uVar46 * 2 + 1);
              uVar80 = (undefined1)(uVar29 >> 0x18);
              uVar78 = (undefined1)(uVar29 >> 0x10);
              uVar76 = (undefined1)(uVar29 >> 8);
              auVar71._4_4_ =
                   (int)(CONCAT35(CONCAT21(CONCAT11(uVar80,uVar80),uVar78),CONCAT14(uVar78,uVar29))
                        >> 0x20);
              auVar71[3] = uVar76;
              auVar71[2] = uVar76;
              auVar71[0] = (undefined1)uVar29;
              auVar71[1] = auVar71[0];
              auVar71._8_8_ = 0;
              auVar83 = pshuflw(auVar71,auVar71,0);
              cVar58 = auVar83[0];
              auVar72[0] = -(cVar58 == *pcVar6);
              cVar77 = auVar83[1];
              auVar72[1] = -(cVar77 == pcVar6[1]);
              cVar79 = auVar83[2];
              auVar72[2] = -(cVar79 == pcVar6[2]);
              cVar81 = auVar83[3];
              auVar72[3] = -(cVar81 == pcVar6[3]);
              auVar72[4] = -(cVar58 == pcVar6[4]);
              auVar72[5] = -(cVar77 == pcVar6[5]);
              auVar72[6] = -(cVar79 == pcVar6[6]);
              auVar72[7] = -(cVar81 == pcVar6[7]);
              auVar72[8] = -(cVar58 == pcVar6[8]);
              auVar72[9] = -(cVar77 == pcVar6[9]);
              auVar72[10] = -(cVar79 == pcVar6[10]);
              auVar72[0xb] = -(cVar81 == pcVar6[0xb]);
              auVar72[0xc] = -(cVar58 == pcVar6[0xc]);
              auVar72[0xd] = -(cVar77 == pcVar6[0xd]);
              auVar72[0xe] = -(cVar79 == pcVar6[0xe]);
              auVar72[0xf] = -(cVar81 == pcVar6[0xf]);
              uVar16 = (ushort)(SUB161(auVar72 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar72 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar72 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar72 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar72 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar72 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar72 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar72 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar72 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar72 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar72 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar72 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar72 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar72 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar72 >> 0x77,0) & 1) << 0xe |
                       (ushort)(auVar72[0xf] >> 7) << 0xf;
              uVar29 = (uint)uVar16;
              if ((bVar8 & 0xf) != 0) {
                uVar29 = (uint)uVar16 << (0x10 - (bVar8 & 0xf) & 0x1f) & 0xfffe |
                         (uint)(uVar16 >> (bVar8 & 0xf));
              }
              if (uVar29 == 0) {
                uVar50 = 0;
              }
              else {
                uVar50 = 0;
                while( true ) {
                  iVar43 = iVar43 + -1;
                  iVar15 = 0;
                  if (uVar29 != 0) {
                    for (; (uVar29 >> iVar15 & 1) == 0; iVar15 = iVar15 + 1) {
                    }
                  }
                  if (pUVar12[uVar46 + (iVar15 + (uint)bVar8 & 0xf)] < uVar44) break;
                  auStack_b8[uVar50] = pUVar12[uVar46 + (iVar15 + (uint)bVar8 & 0xf)];
                  uVar50 = uVar50 + 1;
                  uVar29 = uVar29 & uVar29 - 1;
                  if ((uVar29 == 0) || (iVar43 == 0)) break;
                }
              }
              uVar29 = bVar8 - 1 & 0xf;
              *(char *)(pUVar13 + uVar46) = (char)uVar29;
              *(undefined1 *)((long)(pUVar13 + uVar46) + (ulong)uVar29 + 1) = auVar71[0];
              UVar48 = ms->nextToUpdate;
              ms->nextToUpdate = UVar48 + 1;
              pUVar12[uVar46 + uVar29] = UVar48;
              if (uVar50 == 0) goto LAB_00204c8e;
              uVar46 = 999999999;
              uVar37 = 0;
              pBVar34 = (BYTE *)0x3;
              do {
                uVar29 = auStack_b8[uVar37];
                if (uVar29 < uVar47) {
                  if (*(int *)(pBVar21 + uVar29) == *(int *)puVar40) {
                    sVar22 = ZSTD_count_2segments
                                       ((BYTE *)((long)puVar36 + 5),pBVar21 + (ulong)uVar29 + 4,
                                        (BYTE *)iEnd,pBVar21 + uVar47,pBVar31 + uVar47);
                    pBVar26 = (BYTE *)(sVar22 + 4);
                  }
                  else {
LAB_0020485f:
                    pBVar26 = (BYTE *)0x0;
                  }
                }
                else {
                  puVar30 = (ulong *)(pBVar31 + uVar29);
                  if (pBVar34[(long)puVar30] != *(BYTE *)((long)puVar40 + (long)pBVar34))
                  goto LAB_0020485f;
                  puVar33 = puVar40;
                  if (puVar40 < puVar1) {
                    uVar27 = *puVar40 ^ *puVar30;
                    uVar25 = 0;
                    if (uVar27 != 0) {
                      for (; (uVar27 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                      }
                    }
                    pBVar26 = (BYTE *)(uVar25 >> 3 & 0x1fffffff);
                    puVar33 = (ulong *)((long)puVar36 + 9);
                    if (*puVar30 == *puVar40) {
                      do {
                        puVar30 = puVar30 + 1;
                        if (puVar1 <= puVar33) goto LAB_0020486c;
                        uVar25 = *puVar33;
                        uVar41 = uVar25 ^ *puVar30;
                        uVar27 = 0;
                        if (uVar41 != 0) {
                          for (; (uVar41 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                          }
                        }
                        pBVar26 = (BYTE *)((long)puVar33 +
                                          ((uVar27 >> 3 & 0x1fffffff) - (long)puVar40));
                        puVar33 = puVar33 + 1;
                      } while (*puVar30 == uVar25);
                    }
                  }
                  else {
LAB_0020486c:
                    if ((puVar33 < puVar2) && ((int)*puVar30 == (int)*puVar33)) {
                      puVar33 = (ulong *)((long)puVar33 + 4);
                      puVar30 = (ulong *)((long)puVar30 + 4);
                    }
                    if ((puVar33 < puVar3) && ((short)*puVar30 == (short)*puVar33)) {
                      puVar33 = (ulong *)((long)puVar33 + 2);
                      puVar30 = (ulong *)((long)puVar30 + 2);
                    }
                    if (puVar33 < iEnd) {
                      puVar33 = (ulong *)((long)puVar33 + (ulong)((BYTE)*puVar30 == (BYTE)*puVar33))
                      ;
                    }
                    pBVar26 = (BYTE *)((long)puVar33 - (long)puVar40);
                  }
                }
                pBVar24 = pBVar34;
                if (pBVar34 < pBVar26) {
                  pBVar24 = pBVar26;
                  uVar46 = (ulong)((uVar45 + 2) - uVar29);
                }
              } while ((pBVar26 <= pBVar34 || (ulong *)((long)puVar40 + (long)pBVar26) != iEnd) &&
                      (uVar37 = uVar37 + 1, pBVar34 = pBVar24, uVar37 < uVar50));
            }
            else {
              pUVar12 = ms->hashTable;
              pUVar13 = ms->tagTable;
              pBVar31 = (ms->window).base;
              uVar46 = (long)puVar40 - (long)pBVar31;
              uVar32 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
              uVar29 = (ms->window).lowLimit;
              uVar45 = (uint)uVar46;
              uVar44 = uVar45 - uVar32;
              if (uVar45 - uVar29 <= uVar32) {
                uVar44 = uVar29;
              }
              if (ms->loadedDictEnd != 0) {
                uVar44 = uVar29;
              }
              if (3 < uVar47) {
                uVar47 = 4;
              }
              iVar43 = 1 << ((byte)uVar47 & 0x1f);
              pBVar21 = (ms->window).dictBase;
              uVar47 = (ms->window).dictLimit;
              uVar50 = (ulong)ms->nextToUpdate;
              local_180 = (char)ms->rowHashLog;
              if (ms->nextToUpdate < uVar45) {
                do {
                  uVar32 = (uint)uVar50 & 7;
                  uVar29 = ms->hashCache[uVar32];
                  ms->hashCache[uVar32] =
                       (uint)(*(int *)(pBVar31 + uVar50 + 8) * -0x61c8864f) >>
                       (0x18U - local_180 & 0x1f);
                  uVar37 = (ulong)(uVar29 >> 4 & 0xfffffff0);
                  uVar32 = (byte)((char)pUVar13[uVar37] - 1) & 0xf;
                  *(char *)(pUVar13 + uVar37) = (char)uVar32;
                  *(char *)((long)pUVar13 + (ulong)uVar32 + 1 + uVar37 * 2) = (char)uVar29;
                  pUVar12[uVar37 + uVar32] = (uint)uVar50;
                  uVar50 = uVar50 + 1;
                } while (uVar50 < (uVar46 & 0xffffffff));
              }
              ms->nextToUpdate = uVar45;
              uVar29 = ms->hashCache[uVar45 & 7];
              ms->hashCache[uVar45 & 7] =
                   (uint)(*(int *)(pBVar31 + (uVar46 & 0xffffffff) + 8) * -0x61c8864f) >>
                   (0x18U - local_180 & 0x1f);
              uVar46 = (ulong)(uVar29 >> 4 & 0xfffffff0);
              bVar8 = (byte)pUVar13[uVar46];
              pcVar6 = (char *)((long)pUVar13 + uVar46 * 2 + 1);
              uVar80 = (undefined1)(uVar29 >> 0x18);
              uVar78 = (undefined1)(uVar29 >> 0x10);
              uVar76 = (undefined1)(uVar29 >> 8);
              auVar74._4_4_ =
                   (int)(CONCAT35(CONCAT21(CONCAT11(uVar80,uVar80),uVar78),CONCAT14(uVar78,uVar29))
                        >> 0x20);
              auVar74[3] = uVar76;
              auVar74[2] = uVar76;
              auVar74[0] = (undefined1)uVar29;
              auVar74[1] = auVar74[0];
              auVar74._8_8_ = 0;
              auVar83 = pshuflw(auVar74,auVar74,0);
              cVar58 = auVar83[0];
              auVar75[0] = -(cVar58 == *pcVar6);
              cVar77 = auVar83[1];
              auVar75[1] = -(cVar77 == pcVar6[1]);
              cVar79 = auVar83[2];
              auVar75[2] = -(cVar79 == pcVar6[2]);
              cVar81 = auVar83[3];
              auVar75[3] = -(cVar81 == pcVar6[3]);
              auVar75[4] = -(cVar58 == pcVar6[4]);
              auVar75[5] = -(cVar77 == pcVar6[5]);
              auVar75[6] = -(cVar79 == pcVar6[6]);
              auVar75[7] = -(cVar81 == pcVar6[7]);
              auVar75[8] = -(cVar58 == pcVar6[8]);
              auVar75[9] = -(cVar77 == pcVar6[9]);
              auVar75[10] = -(cVar79 == pcVar6[10]);
              auVar75[0xb] = -(cVar81 == pcVar6[0xb]);
              auVar75[0xc] = -(cVar58 == pcVar6[0xc]);
              auVar75[0xd] = -(cVar77 == pcVar6[0xd]);
              auVar75[0xe] = -(cVar79 == pcVar6[0xe]);
              auVar75[0xf] = -(cVar81 == pcVar6[0xf]);
              uVar16 = (ushort)(SUB161(auVar75 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar75 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar75 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar75 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar75 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar75 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar75 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar75 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar75 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar75 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar75 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar75 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar75 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar75 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar75 >> 0x77,0) & 1) << 0xe |
                       (ushort)(auVar75[0xf] >> 7) << 0xf;
              uVar29 = (uint)uVar16;
              if ((bVar8 & 0xf) != 0) {
                uVar29 = (uint)uVar16 << (0x10 - (bVar8 & 0xf) & 0x1f) & 0xfffe |
                         (uint)(uVar16 >> (bVar8 & 0xf));
              }
              if (uVar29 == 0) {
                uVar50 = 0;
              }
              else {
                uVar50 = 0;
                while( true ) {
                  iVar43 = iVar43 + -1;
                  iVar15 = 0;
                  if (uVar29 != 0) {
                    for (; (uVar29 >> iVar15 & 1) == 0; iVar15 = iVar15 + 1) {
                    }
                  }
                  if (pUVar12[uVar46 + (iVar15 + (uint)bVar8 & 0xf)] < uVar44) break;
                  auStack_b8[uVar50] = pUVar12[uVar46 + (iVar15 + (uint)bVar8 & 0xf)];
                  uVar50 = uVar50 + 1;
                  uVar29 = uVar29 & uVar29 - 1;
                  if ((uVar29 == 0) || (iVar43 == 0)) break;
                }
              }
              uVar29 = bVar8 - 1 & 0xf;
              *(char *)(pUVar13 + uVar46) = (char)uVar29;
              *(undefined1 *)((long)(pUVar13 + uVar46) + (ulong)uVar29 + 1) = auVar74[0];
              UVar48 = ms->nextToUpdate;
              ms->nextToUpdate = UVar48 + 1;
              pUVar12[uVar46 + uVar29] = UVar48;
              if (uVar50 == 0) goto LAB_00204c8e;
              uVar46 = 999999999;
              uVar37 = 0;
              pBVar34 = (BYTE *)0x3;
              do {
                uVar29 = auStack_b8[uVar37];
                if (uVar29 < uVar47) {
                  if (*(int *)(pBVar21 + uVar29) == *(int *)puVar40) {
                    sVar22 = ZSTD_count_2segments
                                       ((BYTE *)((long)puVar36 + 5),pBVar21 + (ulong)uVar29 + 4,
                                        (BYTE *)iEnd,pBVar21 + uVar47,pBVar31 + uVar47);
                    pBVar26 = (BYTE *)(sVar22 + 4);
                  }
                  else {
LAB_00204c09:
                    pBVar26 = (BYTE *)0x0;
                  }
                }
                else {
                  puVar30 = (ulong *)(pBVar31 + uVar29);
                  if (pBVar34[(long)puVar30] != *(BYTE *)((long)puVar40 + (long)pBVar34))
                  goto LAB_00204c09;
                  puVar33 = puVar40;
                  if (puVar40 < puVar1) {
                    uVar27 = *puVar40 ^ *puVar30;
                    uVar25 = 0;
                    if (uVar27 != 0) {
                      for (; (uVar27 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                      }
                    }
                    pBVar26 = (BYTE *)(uVar25 >> 3 & 0x1fffffff);
                    puVar33 = (ulong *)((long)puVar36 + 9);
                    if (*puVar30 == *puVar40) {
                      do {
                        puVar30 = puVar30 + 1;
                        if (puVar1 <= puVar33) goto LAB_00204c16;
                        uVar25 = *puVar33;
                        uVar41 = uVar25 ^ *puVar30;
                        uVar27 = 0;
                        if (uVar41 != 0) {
                          for (; (uVar41 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                          }
                        }
                        pBVar26 = (BYTE *)((long)puVar33 +
                                          ((uVar27 >> 3 & 0x1fffffff) - (long)puVar40));
                        puVar33 = puVar33 + 1;
                      } while (*puVar30 == uVar25);
                    }
                  }
                  else {
LAB_00204c16:
                    if ((puVar33 < puVar2) && ((int)*puVar30 == (int)*puVar33)) {
                      puVar33 = (ulong *)((long)puVar33 + 4);
                      puVar30 = (ulong *)((long)puVar30 + 4);
                    }
                    if ((puVar33 < puVar3) && ((short)*puVar30 == (short)*puVar33)) {
                      puVar33 = (ulong *)((long)puVar33 + 2);
                      puVar30 = (ulong *)((long)puVar30 + 2);
                    }
                    if (puVar33 < iEnd) {
                      puVar33 = (ulong *)((long)puVar33 + (ulong)((BYTE)*puVar30 == (BYTE)*puVar33))
                      ;
                    }
                    pBVar26 = (BYTE *)((long)puVar33 - (long)puVar40);
                  }
                }
                pBVar24 = pBVar34;
                if (pBVar34 < pBVar26) {
                  pBVar24 = pBVar26;
                  uVar46 = (ulong)((uVar45 + 2) - uVar29);
                }
              } while ((pBVar26 <= pBVar34 || (ulong *)((long)puVar40 + (long)pBVar26) != iEnd) &&
                      (uVar37 = uVar37 + 1, pBVar34 = pBVar24, uVar37 < uVar50));
            }
          }
          else if (uVar29 - 6 < 2) {
            pUVar12 = ms->hashTable;
            pUVar13 = ms->tagTable;
            pBVar31 = (ms->window).base;
            uVar46 = (long)puVar40 - (long)pBVar31;
            uVar45 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
            uVar47 = (ms->window).lowLimit;
            uVar44 = (uint)uVar46;
            uVar29 = uVar44 - uVar45;
            if (uVar44 - uVar47 <= uVar45) {
              uVar29 = uVar47;
            }
            pBVar21 = (ms->window).dictBase;
            uVar45 = (ms->window).dictLimit;
            if (ms->loadedDictEnd != 0) {
              uVar29 = uVar47;
            }
            uVar50 = (ulong)ms->nextToUpdate;
            local_180 = (char)ms->rowHashLog;
            if (ms->nextToUpdate < uVar44) {
              do {
                uVar32 = (uint)uVar50 & 7;
                uVar47 = ms->hashCache[uVar32];
                ms->hashCache[uVar32] =
                     (U32)((ulong)(*(long *)(pBVar31 + uVar50 + 8) * -0x30e4432340650000) >>
                          (0x38U - local_180 & 0x3f));
                uVar37 = (ulong)(uVar47 >> 3 & 0xffffffe0);
                uVar32 = (byte)((char)pUVar13[uVar37] - 1) & 0x1f;
                *(char *)(pUVar13 + uVar37) = (char)uVar32;
                *(char *)((long)pUVar13 + (ulong)uVar32 + 1 + uVar37 * 2) = (char)uVar47;
                pUVar12[uVar37 + uVar32] = (uint)uVar50;
                uVar50 = uVar50 + 1;
              } while (uVar50 < (uVar46 & 0xffffffff));
            }
            ms->nextToUpdate = uVar44;
            uVar47 = ms->hashCache[uVar44 & 7];
            ms->hashCache[uVar44 & 7] =
                 (U32)((ulong)(*(long *)(pBVar31 + (uVar46 & 0xffffffff) + 8) * -0x30e4432340650000)
                      >> (0x38U - local_180 & 0x3f));
            uVar46 = (ulong)(uVar47 >> 3 & 0xffffffe0);
            bVar8 = (byte)pUVar13[uVar46];
            pcVar6 = (char *)((long)pUVar13 + uVar46 * 2 + 1);
            pcVar7 = (char *)((long)pUVar13 + uVar46 * 2 + 0x11);
            uVar80 = (undefined1)(uVar47 >> 0x18);
            uVar78 = (undefined1)(uVar47 >> 0x10);
            uVar76 = (undefined1)(uVar47 >> 8);
            auVar86._4_4_ =
                 (int)(CONCAT35(CONCAT21(CONCAT11(uVar80,uVar80),uVar78),CONCAT14(uVar78,uVar47)) >>
                      0x20);
            auVar86[3] = uVar76;
            auVar86[2] = uVar76;
            auVar86[0] = (undefined1)uVar47;
            auVar86[1] = auVar86[0];
            auVar86._8_8_ = 0;
            auVar83 = pshuflw(auVar86,auVar86,0);
            cVar58 = auVar83[0];
            auVar55[0] = -(*pcVar6 == cVar58);
            cVar77 = auVar83[1];
            auVar55[1] = -(pcVar6[1] == cVar77);
            cVar79 = auVar83[2];
            auVar55[2] = -(pcVar6[2] == cVar79);
            cVar81 = auVar83[3];
            auVar55[3] = -(pcVar6[3] == cVar81);
            auVar55[4] = -(pcVar6[4] == cVar58);
            auVar55[5] = -(pcVar6[5] == cVar77);
            auVar55[6] = -(pcVar6[6] == cVar79);
            auVar55[7] = -(pcVar6[7] == cVar81);
            auVar55[8] = -(pcVar6[8] == cVar58);
            auVar55[9] = -(pcVar6[9] == cVar77);
            auVar55[10] = -(pcVar6[10] == cVar79);
            auVar55[0xb] = -(pcVar6[0xb] == cVar81);
            auVar55[0xc] = -(pcVar6[0xc] == cVar58);
            auVar55[0xd] = -(pcVar6[0xd] == cVar77);
            auVar55[0xe] = -(pcVar6[0xe] == cVar79);
            auVar55[0xf] = -(pcVar6[0xf] == cVar81);
            auVar67[0] = -(*pcVar7 == cVar58);
            auVar67[1] = -(pcVar7[1] == cVar77);
            auVar67[2] = -(pcVar7[2] == cVar79);
            auVar67[3] = -(pcVar7[3] == cVar81);
            auVar67[4] = -(pcVar7[4] == cVar58);
            auVar67[5] = -(pcVar7[5] == cVar77);
            auVar67[6] = -(pcVar7[6] == cVar79);
            auVar67[7] = -(pcVar7[7] == cVar81);
            auVar67[8] = -(pcVar7[8] == cVar58);
            auVar67[9] = -(pcVar7[9] == cVar77);
            auVar67[10] = -(pcVar7[10] == cVar79);
            auVar67[0xb] = -(pcVar7[0xb] == cVar81);
            auVar67[0xc] = -(pcVar7[0xc] == cVar58);
            auVar67[0xd] = -(pcVar7[0xd] == cVar77);
            auVar67[0xe] = -(pcVar7[0xe] == cVar79);
            auVar67[0xf] = -(pcVar7[0xf] == cVar81);
            uVar32 = CONCAT22((ushort)(SUB161(auVar67 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar67 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar67 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar67 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar67 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar67 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar67 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar67 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar67 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar67 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar67 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar67 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar67 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar67 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar67 >> 0x77,0) & 1) << 0xe |
                              (ushort)(auVar67[0xf] >> 7) << 0xf,
                              (ushort)(SUB161(auVar55 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar55 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar55 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar55 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar55 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar55 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar55 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar55 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar55 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar55 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar55 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar55 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar55 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar55 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar55 >> 0x77,0) & 1) << 0xe |
                              (ushort)(auVar55[0xf] >> 7) << 0xf);
            uVar47 = uVar32 >> (bVar8 & 0x1f) | uVar32 << 0x20 - (bVar8 & 0x1f);
            if ((bVar8 & 0x1f) == 0) {
              uVar47 = uVar32;
            }
            if (uVar47 == 0) {
              uVar50 = 0;
            }
            else {
              uVar50 = 0;
              iVar43 = -0x1f;
              while( true ) {
                iVar15 = 0;
                if (uVar47 != 0) {
                  for (; (uVar47 >> iVar15 & 1) == 0; iVar15 = iVar15 + 1) {
                  }
                }
                if (pUVar12[uVar46 + (iVar15 + (uint)bVar8 & 0x1f)] < uVar29) break;
                auStack_b8[uVar50] = pUVar12[uVar46 + (iVar15 + (uint)bVar8 & 0x1f)];
                uVar50 = uVar50 + 1;
                uVar47 = uVar47 & uVar47 - 1;
                if ((uVar47 == 0) || (bVar51 = iVar43 == 0, iVar43 = iVar43 + 1, bVar51)) break;
              }
            }
            uVar47 = bVar8 - 1 & 0x1f;
            *(char *)(pUVar13 + uVar46) = (char)uVar47;
            *(undefined1 *)((long)(pUVar13 + uVar46) + (ulong)uVar47 + 1) = auVar86[0];
            UVar48 = ms->nextToUpdate;
            ms->nextToUpdate = UVar48 + 1;
            pUVar12[uVar46 + uVar47] = UVar48;
            if (uVar50 == 0) goto LAB_00204c8e;
            uVar46 = 999999999;
            uVar37 = 0;
            pBVar34 = (BYTE *)0x3;
            do {
              uVar47 = auStack_b8[uVar37];
              if (uVar47 < uVar45) {
                if (*(int *)(pBVar21 + uVar47) == *(int *)puVar40) {
                  sVar22 = ZSTD_count_2segments
                                     ((BYTE *)((long)puVar36 + 5),pBVar21 + (ulong)uVar47 + 4,
                                      (BYTE *)iEnd,pBVar21 + uVar45,pBVar31 + uVar45);
                  pBVar26 = (BYTE *)(sVar22 + 4);
                }
                else {
LAB_002042cf:
                  pBVar26 = (BYTE *)0x0;
                }
              }
              else {
                puVar30 = (ulong *)(pBVar31 + uVar47);
                if (pBVar34[(long)puVar30] != *(BYTE *)((long)puVar40 + (long)pBVar34))
                goto LAB_002042cf;
                puVar33 = puVar40;
                if (puVar40 < puVar1) {
                  uVar27 = *puVar40 ^ *puVar30;
                  uVar25 = 0;
                  if (uVar27 != 0) {
                    for (; (uVar27 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                    }
                  }
                  pBVar26 = (BYTE *)(uVar25 >> 3 & 0x1fffffff);
                  puVar33 = (ulong *)((long)puVar36 + 9);
                  if (*puVar30 == *puVar40) {
                    do {
                      puVar30 = puVar30 + 1;
                      if (puVar1 <= puVar33) goto LAB_002042dc;
                      uVar25 = *puVar33;
                      uVar41 = uVar25 ^ *puVar30;
                      uVar27 = 0;
                      if (uVar41 != 0) {
                        for (; (uVar41 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                        }
                      }
                      pBVar26 = (BYTE *)((long)puVar33 +
                                        ((uVar27 >> 3 & 0x1fffffff) - (long)puVar40));
                      puVar33 = puVar33 + 1;
                    } while (*puVar30 == uVar25);
                  }
                }
                else {
LAB_002042dc:
                  if ((puVar33 < puVar2) && ((int)*puVar30 == (int)*puVar33)) {
                    puVar33 = (ulong *)((long)puVar33 + 4);
                    puVar30 = (ulong *)((long)puVar30 + 4);
                  }
                  if ((puVar33 < puVar3) && ((short)*puVar30 == (short)*puVar33)) {
                    puVar33 = (ulong *)((long)puVar33 + 2);
                    puVar30 = (ulong *)((long)puVar30 + 2);
                  }
                  if (puVar33 < iEnd) {
                    puVar33 = (ulong *)((long)puVar33 + (ulong)((BYTE)*puVar30 == (BYTE)*puVar33));
                  }
                  pBVar26 = (BYTE *)((long)puVar33 - (long)puVar40);
                }
              }
              pBVar24 = pBVar34;
              if (pBVar34 < pBVar26) {
                pBVar24 = pBVar26;
                uVar46 = (ulong)((uVar44 + 2) - uVar47);
              }
            } while ((pBVar26 <= pBVar34 || (ulong *)((long)puVar40 + (long)pBVar26) != iEnd) &&
                    (uVar37 = uVar37 + 1, pBVar34 = pBVar24, uVar37 < uVar50));
          }
          else if (uVar29 == 5) {
            pUVar12 = ms->hashTable;
            pUVar13 = ms->tagTable;
            pBVar31 = (ms->window).base;
            uVar46 = (long)puVar40 - (long)pBVar31;
            uVar45 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
            uVar47 = (ms->window).lowLimit;
            uVar44 = (uint)uVar46;
            uVar29 = uVar44 - uVar45;
            if (uVar44 - uVar47 <= uVar45) {
              uVar29 = uVar47;
            }
            pBVar21 = (ms->window).dictBase;
            uVar45 = (ms->window).dictLimit;
            if (ms->loadedDictEnd != 0) {
              uVar29 = uVar47;
            }
            uVar50 = (ulong)ms->nextToUpdate;
            local_180 = (char)ms->rowHashLog;
            if (ms->nextToUpdate < uVar44) {
              do {
                uVar32 = (uint)uVar50 & 7;
                uVar47 = ms->hashCache[uVar32];
                ms->hashCache[uVar32] =
                     (U32)((ulong)(*(long *)(pBVar31 + uVar50 + 8) * -0x30e4432345000000) >>
                          (0x38U - local_180 & 0x3f));
                uVar37 = (ulong)(uVar47 >> 3 & 0xffffffe0);
                uVar32 = (byte)((char)pUVar13[uVar37] - 1) & 0x1f;
                *(char *)(pUVar13 + uVar37) = (char)uVar32;
                *(char *)((long)pUVar13 + (ulong)uVar32 + 1 + uVar37 * 2) = (char)uVar47;
                pUVar12[uVar37 + uVar32] = (uint)uVar50;
                uVar50 = uVar50 + 1;
              } while (uVar50 < (uVar46 & 0xffffffff));
            }
            ms->nextToUpdate = uVar44;
            uVar47 = ms->hashCache[uVar44 & 7];
            ms->hashCache[uVar44 & 7] =
                 (U32)((ulong)(*(long *)(pBVar31 + (uVar46 & 0xffffffff) + 8) * -0x30e4432345000000)
                      >> (0x38U - local_180 & 0x3f));
            uVar46 = (ulong)(uVar47 >> 3 & 0xffffffe0);
            bVar8 = (byte)pUVar13[uVar46];
            pcVar6 = (char *)((long)pUVar13 + uVar46 * 2 + 1);
            pcVar7 = (char *)((long)pUVar13 + uVar46 * 2 + 0x11);
            uVar80 = (undefined1)(uVar47 >> 0x18);
            uVar78 = (undefined1)(uVar47 >> 0x10);
            uVar76 = (undefined1)(uVar47 >> 8);
            auVar87._4_4_ =
                 (int)(CONCAT35(CONCAT21(CONCAT11(uVar80,uVar80),uVar78),CONCAT14(uVar78,uVar47)) >>
                      0x20);
            auVar87[3] = uVar76;
            auVar87[2] = uVar76;
            auVar87[0] = (undefined1)uVar47;
            auVar87[1] = auVar87[0];
            auVar87._8_8_ = 0;
            auVar83 = pshuflw(auVar87,auVar87,0);
            cVar58 = auVar83[0];
            auVar56[0] = -(*pcVar6 == cVar58);
            cVar77 = auVar83[1];
            auVar56[1] = -(pcVar6[1] == cVar77);
            cVar79 = auVar83[2];
            auVar56[2] = -(pcVar6[2] == cVar79);
            cVar81 = auVar83[3];
            auVar56[3] = -(pcVar6[3] == cVar81);
            auVar56[4] = -(pcVar6[4] == cVar58);
            auVar56[5] = -(pcVar6[5] == cVar77);
            auVar56[6] = -(pcVar6[6] == cVar79);
            auVar56[7] = -(pcVar6[7] == cVar81);
            auVar56[8] = -(pcVar6[8] == cVar58);
            auVar56[9] = -(pcVar6[9] == cVar77);
            auVar56[10] = -(pcVar6[10] == cVar79);
            auVar56[0xb] = -(pcVar6[0xb] == cVar81);
            auVar56[0xc] = -(pcVar6[0xc] == cVar58);
            auVar56[0xd] = -(pcVar6[0xd] == cVar77);
            auVar56[0xe] = -(pcVar6[0xe] == cVar79);
            auVar56[0xf] = -(pcVar6[0xf] == cVar81);
            auVar70[0] = -(*pcVar7 == cVar58);
            auVar70[1] = -(pcVar7[1] == cVar77);
            auVar70[2] = -(pcVar7[2] == cVar79);
            auVar70[3] = -(pcVar7[3] == cVar81);
            auVar70[4] = -(pcVar7[4] == cVar58);
            auVar70[5] = -(pcVar7[5] == cVar77);
            auVar70[6] = -(pcVar7[6] == cVar79);
            auVar70[7] = -(pcVar7[7] == cVar81);
            auVar70[8] = -(pcVar7[8] == cVar58);
            auVar70[9] = -(pcVar7[9] == cVar77);
            auVar70[10] = -(pcVar7[10] == cVar79);
            auVar70[0xb] = -(pcVar7[0xb] == cVar81);
            auVar70[0xc] = -(pcVar7[0xc] == cVar58);
            auVar70[0xd] = -(pcVar7[0xd] == cVar77);
            auVar70[0xe] = -(pcVar7[0xe] == cVar79);
            auVar70[0xf] = -(pcVar7[0xf] == cVar81);
            uVar32 = CONCAT22((ushort)(SUB161(auVar70 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar70 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar70 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar70 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar70 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar70 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar70 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar70 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar70 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar70 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar70 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar70 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar70 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar70 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar70 >> 0x77,0) & 1) << 0xe |
                              (ushort)(auVar70[0xf] >> 7) << 0xf,
                              (ushort)(SUB161(auVar56 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar56 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar56 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar56 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar56 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar56 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar56 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar56 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar56 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar56 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar56 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar56 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar56 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar56 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar56 >> 0x77,0) & 1) << 0xe |
                              (ushort)(auVar56[0xf] >> 7) << 0xf);
            uVar47 = uVar32 >> (bVar8 & 0x1f) | uVar32 << 0x20 - (bVar8 & 0x1f);
            if ((bVar8 & 0x1f) == 0) {
              uVar47 = uVar32;
            }
            if (uVar47 == 0) {
              uVar50 = 0;
            }
            else {
              uVar50 = 0;
              iVar43 = -0x1f;
              while( true ) {
                iVar15 = 0;
                if (uVar47 != 0) {
                  for (; (uVar47 >> iVar15 & 1) == 0; iVar15 = iVar15 + 1) {
                  }
                }
                if (pUVar12[uVar46 + (iVar15 + (uint)bVar8 & 0x1f)] < uVar29) break;
                auStack_b8[uVar50] = pUVar12[uVar46 + (iVar15 + (uint)bVar8 & 0x1f)];
                uVar50 = uVar50 + 1;
                uVar47 = uVar47 & uVar47 - 1;
                if ((uVar47 == 0) || (bVar51 = iVar43 == 0, iVar43 = iVar43 + 1, bVar51)) break;
              }
            }
            uVar47 = bVar8 - 1 & 0x1f;
            *(char *)(pUVar13 + uVar46) = (char)uVar47;
            *(undefined1 *)((long)(pUVar13 + uVar46) + (ulong)uVar47 + 1) = auVar87[0];
            UVar48 = ms->nextToUpdate;
            ms->nextToUpdate = UVar48 + 1;
            pUVar12[uVar46 + uVar47] = UVar48;
            if (uVar50 == 0) {
LAB_00204c8e:
              pBVar24 = (BYTE *)0x3;
              uVar46 = 999999999;
            }
            else {
              uVar46 = 999999999;
              uVar37 = 0;
              pBVar34 = (BYTE *)0x3;
              do {
                uVar47 = auStack_b8[uVar37];
                if (uVar47 < uVar45) {
                  if (*(int *)(pBVar21 + uVar47) == *(int *)puVar40) {
                    sVar22 = ZSTD_count_2segments
                                       ((BYTE *)((long)puVar36 + 5),pBVar21 + (ulong)uVar47 + 4,
                                        (BYTE *)iEnd,pBVar21 + uVar45,pBVar31 + uVar45);
                    pBVar26 = (BYTE *)(sVar22 + 4);
                  }
                  else {
LAB_00204687:
                    pBVar26 = (BYTE *)0x0;
                  }
                }
                else {
                  puVar30 = (ulong *)(pBVar31 + uVar47);
                  if (pBVar34[(long)puVar30] != *(BYTE *)((long)puVar40 + (long)pBVar34))
                  goto LAB_00204687;
                  puVar33 = puVar40;
                  if (puVar40 < puVar1) {
                    uVar27 = *puVar40 ^ *puVar30;
                    uVar25 = 0;
                    if (uVar27 != 0) {
                      for (; (uVar27 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                      }
                    }
                    pBVar26 = (BYTE *)(uVar25 >> 3 & 0x1fffffff);
                    puVar33 = (ulong *)((long)puVar36 + 9);
                    if (*puVar30 == *puVar40) {
                      do {
                        puVar30 = puVar30 + 1;
                        if (puVar1 <= puVar33) goto LAB_00204694;
                        uVar25 = *puVar33;
                        uVar41 = uVar25 ^ *puVar30;
                        uVar27 = 0;
                        if (uVar41 != 0) {
                          for (; (uVar41 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                          }
                        }
                        pBVar26 = (BYTE *)((long)puVar33 +
                                          ((uVar27 >> 3 & 0x1fffffff) - (long)puVar40));
                        puVar33 = puVar33 + 1;
                      } while (*puVar30 == uVar25);
                    }
                  }
                  else {
LAB_00204694:
                    if ((puVar33 < puVar2) && ((int)*puVar30 == (int)*puVar33)) {
                      puVar33 = (ulong *)((long)puVar33 + 4);
                      puVar30 = (ulong *)((long)puVar30 + 4);
                    }
                    if ((puVar33 < puVar3) && ((short)*puVar30 == (short)*puVar33)) {
                      puVar33 = (ulong *)((long)puVar33 + 2);
                      puVar30 = (ulong *)((long)puVar30 + 2);
                    }
                    if (puVar33 < iEnd) {
                      puVar33 = (ulong *)((long)puVar33 + (ulong)((BYTE)*puVar30 == (BYTE)*puVar33))
                      ;
                    }
                    pBVar26 = (BYTE *)((long)puVar33 - (long)puVar40);
                  }
                }
                pBVar24 = pBVar34;
                if (pBVar34 < pBVar26) {
                  pBVar24 = pBVar26;
                  uVar46 = (ulong)((uVar44 + 2) - uVar47);
                }
              } while ((pBVar26 <= pBVar34 || (ulong *)((long)puVar40 + (long)pBVar26) != iEnd) &&
                      (uVar37 = uVar37 + 1, pBVar34 = pBVar24, uVar37 < uVar50));
            }
          }
          else {
            pUVar12 = ms->hashTable;
            pUVar13 = ms->tagTable;
            pBVar31 = (ms->window).base;
            uVar46 = (long)puVar40 - (long)pBVar31;
            uVar45 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
            uVar47 = (ms->window).lowLimit;
            uVar44 = (uint)uVar46;
            uVar29 = uVar44 - uVar45;
            if (uVar44 - uVar47 <= uVar45) {
              uVar29 = uVar47;
            }
            pBVar21 = (ms->window).dictBase;
            uVar45 = (ms->window).dictLimit;
            if (ms->loadedDictEnd != 0) {
              uVar29 = uVar47;
            }
            uVar50 = (ulong)ms->nextToUpdate;
            cVar58 = (char)ms->rowHashLog;
            if (ms->nextToUpdate < uVar44) {
              do {
                uVar32 = (uint)uVar50 & 7;
                uVar47 = ms->hashCache[uVar32];
                ms->hashCache[uVar32] =
                     (uint)(*(int *)(pBVar31 + uVar50 + 8) * -0x61c8864f) >> (0x18U - cVar58 & 0x1f)
                ;
                uVar37 = (ulong)(uVar47 >> 3 & 0xffffffe0);
                uVar32 = (byte)((char)pUVar13[uVar37] - 1) & 0x1f;
                *(char *)(pUVar13 + uVar37) = (char)uVar32;
                *(char *)((long)pUVar13 + (ulong)uVar32 + 1 + uVar37 * 2) = (char)uVar47;
                pUVar12[uVar37 + uVar32] = (uint)uVar50;
                uVar50 = uVar50 + 1;
              } while (uVar50 < (uVar46 & 0xffffffff));
            }
            ms->nextToUpdate = uVar44;
            uVar47 = ms->hashCache[uVar44 & 7];
            ms->hashCache[uVar44 & 7] =
                 (uint)(*(int *)(pBVar31 + (uVar46 & 0xffffffff) + 8) * -0x61c8864f) >>
                 (0x18U - cVar58 & 0x1f);
            uVar46 = (ulong)(uVar47 >> 3 & 0xffffffe0);
            bVar8 = (byte)pUVar13[uVar46];
            pcVar6 = (char *)((long)pUVar13 + uVar46 * 2 + 1);
            pcVar7 = (char *)((long)pUVar13 + uVar46 * 2 + 0x11);
            uVar80 = (undefined1)(uVar47 >> 0x18);
            uVar78 = (undefined1)(uVar47 >> 0x10);
            uVar76 = (undefined1)(uVar47 >> 8);
            auVar88._4_4_ =
                 (int)(CONCAT35(CONCAT21(CONCAT11(uVar80,uVar80),uVar78),CONCAT14(uVar78,uVar47)) >>
                      0x20);
            auVar88[3] = uVar76;
            auVar88[2] = uVar76;
            auVar88[0] = (undefined1)uVar47;
            auVar88[1] = auVar88[0];
            auVar88._8_8_ = 0;
            auVar83 = pshuflw(auVar88,auVar88,0);
            cVar58 = auVar83[0];
            auVar57[0] = -(*pcVar6 == cVar58);
            cVar77 = auVar83[1];
            auVar57[1] = -(pcVar6[1] == cVar77);
            cVar79 = auVar83[2];
            auVar57[2] = -(pcVar6[2] == cVar79);
            cVar81 = auVar83[3];
            auVar57[3] = -(pcVar6[3] == cVar81);
            auVar57[4] = -(pcVar6[4] == cVar58);
            auVar57[5] = -(pcVar6[5] == cVar77);
            auVar57[6] = -(pcVar6[6] == cVar79);
            auVar57[7] = -(pcVar6[7] == cVar81);
            auVar57[8] = -(pcVar6[8] == cVar58);
            auVar57[9] = -(pcVar6[9] == cVar77);
            auVar57[10] = -(pcVar6[10] == cVar79);
            auVar57[0xb] = -(pcVar6[0xb] == cVar81);
            auVar57[0xc] = -(pcVar6[0xc] == cVar58);
            auVar57[0xd] = -(pcVar6[0xd] == cVar77);
            auVar57[0xe] = -(pcVar6[0xe] == cVar79);
            auVar57[0xf] = -(pcVar6[0xf] == cVar81);
            auVar73[0] = -(*pcVar7 == cVar58);
            auVar73[1] = -(pcVar7[1] == cVar77);
            auVar73[2] = -(pcVar7[2] == cVar79);
            auVar73[3] = -(pcVar7[3] == cVar81);
            auVar73[4] = -(pcVar7[4] == cVar58);
            auVar73[5] = -(pcVar7[5] == cVar77);
            auVar73[6] = -(pcVar7[6] == cVar79);
            auVar73[7] = -(pcVar7[7] == cVar81);
            auVar73[8] = -(pcVar7[8] == cVar58);
            auVar73[9] = -(pcVar7[9] == cVar77);
            auVar73[10] = -(pcVar7[10] == cVar79);
            auVar73[0xb] = -(pcVar7[0xb] == cVar81);
            auVar73[0xc] = -(pcVar7[0xc] == cVar58);
            auVar73[0xd] = -(pcVar7[0xd] == cVar77);
            auVar73[0xe] = -(pcVar7[0xe] == cVar79);
            auVar73[0xf] = -(pcVar7[0xf] == cVar81);
            uVar32 = CONCAT22((ushort)(SUB161(auVar73 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar73 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar73 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar73 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar73 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar73 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar73 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar73 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar73 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar73 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar73 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar73 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar73 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar73 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar73 >> 0x77,0) & 1) << 0xe |
                              (ushort)(auVar73[0xf] >> 7) << 0xf,
                              (ushort)(SUB161(auVar57 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar57 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar57 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar57 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar57 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar57 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar57 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar57 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar57 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar57 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar57 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar57 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar57 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar57 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar57 >> 0x77,0) & 1) << 0xe |
                              (ushort)(auVar57[0xf] >> 7) << 0xf);
            uVar47 = uVar32 >> (bVar8 & 0x1f) | uVar32 << 0x20 - (bVar8 & 0x1f);
            if ((bVar8 & 0x1f) == 0) {
              uVar47 = uVar32;
            }
            if (uVar47 == 0) {
              uVar50 = 0;
            }
            else {
              uVar50 = 0;
              iVar43 = -0x1f;
              while( true ) {
                iVar15 = 0;
                if (uVar47 != 0) {
                  for (; (uVar47 >> iVar15 & 1) == 0; iVar15 = iVar15 + 1) {
                  }
                }
                if (pUVar12[uVar46 + (iVar15 + (uint)bVar8 & 0x1f)] < uVar29) break;
                auStack_b8[uVar50] = pUVar12[uVar46 + (iVar15 + (uint)bVar8 & 0x1f)];
                uVar50 = uVar50 + 1;
                uVar47 = uVar47 & uVar47 - 1;
                if ((uVar47 == 0) || (bVar51 = iVar43 == 0, iVar43 = iVar43 + 1, bVar51)) break;
              }
            }
            uVar47 = bVar8 - 1 & 0x1f;
            *(char *)(pUVar13 + uVar46) = (char)uVar47;
            *(undefined1 *)((long)(pUVar13 + uVar46) + (ulong)uVar47 + 1) = auVar88[0];
            UVar48 = ms->nextToUpdate;
            ms->nextToUpdate = UVar48 + 1;
            pUVar12[uVar46 + uVar47] = UVar48;
            if (uVar50 == 0) goto LAB_00204c8e;
            uVar46 = 999999999;
            uVar37 = 0;
            pBVar34 = (BYTE *)0x3;
            do {
              uVar47 = auStack_b8[uVar37];
              if (uVar47 < uVar45) {
                if (*(int *)(pBVar21 + uVar47) == *(int *)puVar40) {
                  sVar22 = ZSTD_count_2segments
                                     ((BYTE *)((long)puVar36 + 5),pBVar21 + (ulong)uVar47 + 4,
                                      (BYTE *)iEnd,pBVar21 + uVar45,pBVar31 + uVar45);
                  pBVar26 = (BYTE *)(sVar22 + 4);
                }
                else {
LAB_00204a31:
                  pBVar26 = (BYTE *)0x0;
                }
              }
              else {
                puVar30 = (ulong *)(pBVar31 + uVar47);
                if (pBVar34[(long)puVar30] != *(BYTE *)((long)puVar40 + (long)pBVar34))
                goto LAB_00204a31;
                puVar33 = puVar40;
                if (puVar40 < puVar1) {
                  uVar27 = *puVar40 ^ *puVar30;
                  uVar25 = 0;
                  if (uVar27 != 0) {
                    for (; (uVar27 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                    }
                  }
                  pBVar26 = (BYTE *)(uVar25 >> 3 & 0x1fffffff);
                  puVar33 = (ulong *)((long)puVar36 + 9);
                  if (*puVar30 == *puVar40) {
                    do {
                      puVar30 = puVar30 + 1;
                      if (puVar1 <= puVar33) goto LAB_00204a3e;
                      uVar25 = *puVar33;
                      uVar41 = uVar25 ^ *puVar30;
                      uVar27 = 0;
                      if (uVar41 != 0) {
                        for (; (uVar41 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                        }
                      }
                      pBVar26 = (BYTE *)((long)puVar33 +
                                        ((uVar27 >> 3 & 0x1fffffff) - (long)puVar40));
                      puVar33 = puVar33 + 1;
                    } while (*puVar30 == uVar25);
                  }
                }
                else {
LAB_00204a3e:
                  if ((puVar33 < puVar2) && ((int)*puVar30 == (int)*puVar33)) {
                    puVar33 = (ulong *)((long)puVar33 + 4);
                    puVar30 = (ulong *)((long)puVar30 + 4);
                  }
                  if ((puVar33 < puVar3) && ((short)*puVar30 == (short)*puVar33)) {
                    puVar33 = (ulong *)((long)puVar33 + 2);
                    puVar30 = (ulong *)((long)puVar30 + 2);
                  }
                  if (puVar33 < iEnd) {
                    puVar33 = (ulong *)((long)puVar33 + (ulong)((BYTE)*puVar30 == (BYTE)*puVar33));
                  }
                  pBVar26 = (BYTE *)((long)puVar33 - (long)puVar40);
                }
              }
              pBVar24 = pBVar34;
              if (pBVar34 < pBVar26) {
                pBVar24 = pBVar26;
                uVar46 = (ulong)((uVar44 + 2) - uVar47);
              }
            } while ((pBVar26 <= pBVar34 || (ulong *)((long)puVar40 + (long)pBVar26) != iEnd) &&
                    (uVar37 = uVar37 + 1, pBVar34 = pBVar24, uVar37 < uVar50));
          }
          bVar51 = true;
          if ((BYTE *)0x3 < pBVar24) {
            uVar29 = (int)uVar23 + 1;
            uVar47 = 0x1f;
            if (uVar29 != 0) {
              for (; uVar29 >> uVar47 == 0; uVar47 = uVar47 - 1) {
              }
            }
            uVar29 = (int)uVar46 + 1;
            iVar43 = 0x1f;
            if (uVar29 != 0) {
              for (; uVar29 >> iVar43 == 0; iVar43 = iVar43 + -1) {
              }
            }
            if ((int)((uVar47 ^ 0x1f) + (int)local_160 * 4 + -0x1b) < (int)pBVar24 * 4 - iVar43) {
              bVar51 = false;
              uVar23 = uVar46;
              local_160 = pBVar24;
              local_128 = puVar40;
            }
          }
          puVar36 = puVar40;
        } while (!bVar51);
        if (uVar23 == 0) {
          UVar48 = 1;
          uVar47 = local_134;
        }
        else {
          pBVar34 = (BYTE *)((long)local_128 + (2 - (long)(base_00 + uVar23)));
          pBVar21 = iStart;
          pBVar31 = base_00;
          if ((uint)pBVar34 < uVar9) {
            pBVar21 = pBVar11 + uVar10;
            pBVar31 = pBVar11;
          }
          if ((local_130 < local_128) &&
             (uVar46 = (ulong)pBVar34 & 0xffffffff, pBVar21 < pBVar31 + uVar46)) {
            pBVar31 = pBVar31 + uVar46;
            do {
              pBVar31 = pBVar31 + -1;
              puVar36 = (ulong *)((long)local_128 + -1);
              if ((*(BYTE *)puVar36 != *pBVar31) ||
                 (local_160 = local_160 + 1, local_128 = puVar36, puVar36 <= local_130)) break;
            } while (pBVar21 < pBVar31);
          }
          UVar48 = (int)uVar23 + 1;
          uVar47 = (int)uVar23 - 2;
          uVar42 = local_134;
        }
        local_134 = uVar47;
        uVar23 = (long)local_128 - (long)local_130;
        if (puVar4 < local_128) {
          puVar40 = (ulong *)seqStore->lit;
          puVar36 = puVar40;
          puVar30 = local_130;
          if (local_130 <= puVar4) {
            puVar36 = (ulong *)((long)puVar40 + ((long)puVar4 - (long)local_130));
            uVar46 = local_130[1];
            *puVar40 = *local_130;
            puVar40[1] = uVar46;
            puVar30 = puVar4;
            if (0x10 < (long)puVar4 - (long)local_130) {
              lVar38 = 0x10;
              do {
                uVar17 = *(undefined8 *)((BYTE *)((long)local_130 + lVar38) + 8);
                puVar5 = (undefined8 *)((long)puVar40 + lVar38);
                *puVar5 = *(undefined8 *)((long)local_130 + lVar38);
                puVar5[1] = uVar17;
                pBVar31 = (BYTE *)((long)local_130 + lVar38 + 0x10);
                uVar17 = *(undefined8 *)(pBVar31 + 8);
                puVar5[2] = *(undefined8 *)pBVar31;
                puVar5[3] = uVar17;
                lVar38 = lVar38 + 0x20;
              } while (puVar5 + 4 < puVar36);
            }
          }
          if (puVar30 < local_128) {
            lVar38 = 0;
            do {
              *(BYTE *)((long)puVar36 + lVar38) = *(BYTE *)((long)puVar30 + lVar38);
              lVar38 = lVar38 + 1;
            } while ((long)local_128 - (long)puVar30 != lVar38);
          }
        }
        else {
          puVar36 = (ulong *)seqStore->lit;
          uVar46 = local_130[1];
          *puVar36 = *local_130;
          puVar36[1] = uVar46;
          if (0x10 < uVar23) {
            pBVar31 = seqStore->lit;
            uVar46 = local_130[3];
            *(ulong *)(pBVar31 + 0x10) = local_130[2];
            *(ulong *)(pBVar31 + 0x18) = uVar46;
            if (0x20 < (long)uVar23) {
              lVar38 = 0;
              do {
                pBVar34 = (BYTE *)((long)local_130 + lVar38 + 0x20);
                uVar17 = *(undefined8 *)(pBVar34 + 8);
                pBVar21 = pBVar31 + lVar38 + 0x20;
                *(undefined8 *)pBVar21 = *(undefined8 *)pBVar34;
                *(undefined8 *)(pBVar21 + 8) = uVar17;
                pBVar34 = (BYTE *)((long)local_130 + lVar38 + 0x30);
                uVar17 = *(undefined8 *)(pBVar34 + 8);
                *(undefined8 *)(pBVar21 + 0x10) = *(undefined8 *)pBVar34;
                *(undefined8 *)(pBVar21 + 0x18) = uVar17;
                lVar38 = lVar38 + 0x20;
              } while (pBVar21 + 0x20 < pBVar31 + uVar23);
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar23;
        if (0xffff < uVar23) {
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
        psVar14 = seqStore->sequences;
        psVar14->litLength = (U16)uVar23;
        psVar14->offset = UVar48;
        if ((BYTE *)0xffff < local_160 + -3) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar14->matchLength = (U16)(local_160 + -3);
        seqStore->sequences = psVar14 + 1;
        puVar36 = (ulong *)((long)local_128 + (long)local_160);
        local_130 = puVar36;
        do {
          if (iLimit < puVar36) break;
          iVar35 = (int)puVar36 - (int)base_00;
          UVar48 = (ms->window).lowLimit;
          UVar28 = iVar35 - uVar18;
          if (iVar35 - UVar48 <= uVar18) {
            UVar28 = UVar48;
          }
          if (ms->loadedDictEnd != 0) {
            UVar28 = UVar48;
          }
          uVar47 = iVar35 - uVar42;
          pBVar31 = base_00;
          if (uVar47 < uVar9) {
            pBVar31 = pBVar11;
          }
          bVar51 = false;
          uVar29 = uVar42;
          if ((2 < iVar19 - uVar47) && (uVar42 < iVar35 - UVar28)) {
            if ((int)*puVar36 == *(int *)(pBVar31 + uVar47)) {
              puVar40 = iEnd;
              if (uVar47 < uVar9) {
                puVar40 = puVar20;
              }
              sVar22 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar36 + 4),(BYTE *)((long)(pBVar31 + uVar47) + 4)
                                  ,(BYTE *)iEnd,(BYTE *)puVar40,iStart);
              if (local_130 <= puVar4) {
                puVar40 = (ulong *)seqStore->lit;
                uVar23 = local_130[1];
                *puVar40 = *local_130;
                puVar40[1] = uVar23;
              }
              psVar14 = seqStore->sequences;
              psVar14->litLength = 0;
              psVar14->offset = 1;
              if (0xffff < sVar22 + 1) {
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar14->matchLength = (U16)(sVar22 + 1);
              seqStore->sequences = psVar14 + 1;
              puVar36 = (ulong *)((long)puVar36 + sVar22 + 4);
              bVar51 = true;
              uVar29 = local_134;
              local_134 = uVar42;
              local_130 = puVar36;
            }
            else {
              bVar51 = false;
            }
          }
          uVar42 = uVar29;
        } while (bVar51);
      }
    } while (puVar36 < iLimit);
  }
  *rep = local_134;
  rep[1] = uVar42;
  return (long)iEnd - (long)local_130;
}

Assistant:

size_t ZSTD_compressBlock_lazy_extDict_row(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)

{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, search_rowHash, 1);
}